

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  uint uVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  bool bVar63;
  undefined1 auVar64 [12];
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  uint uVar81;
  ulong uVar82;
  long lVar83;
  undefined1 auVar84 [8];
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  bool bVar88;
  float fVar89;
  float fVar118;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar90;
  float fVar91;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar127;
  float fVar129;
  float fVar131;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar135;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar169;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar168;
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar152 [32];
  float fVar170;
  float fVar172;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar145 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar213;
  float fVar214;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar215;
  undefined1 auVar197 [16];
  float fVar216;
  float fVar219;
  float fVar220;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  float fVar217;
  float fVar218;
  undefined1 auVar212 [64];
  float fVar221;
  float fVar239;
  float fVar240;
  vint4 bi;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar242;
  float fVar248;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar241;
  float fVar243;
  float fVar245;
  float fVar247;
  float fVar249;
  undefined1 auVar233 [28];
  float fVar244;
  float fVar246;
  undefined1 auVar238 [64];
  float fVar250;
  float fVar251;
  float fVar268;
  float fVar270;
  vint4 ai_2;
  undefined1 auVar252 [16];
  float fVar272;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar269;
  float fVar271;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar277;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar290;
  float fVar293;
  undefined1 auVar281 [16];
  float fVar291;
  float fVar294;
  float fVar297;
  undefined1 auVar284 [32];
  float fVar292;
  float fVar295;
  float fVar298;
  float fVar300;
  float fVar302;
  float fVar304;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar296;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar289 [64];
  float fVar305;
  float fVar315;
  float fVar316;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  float fVar318;
  undefined1 auVar310 [32];
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar314 [64];
  float fVar326;
  float fVar330;
  float fVar331;
  vint4 ai_1;
  undefined1 auVar327 [16];
  float fVar332;
  undefined1 auVar328 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar329 [32];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [28];
  undefined1 auVar340 [32];
  float fVar343;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar344;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [32];
  float fVar350;
  float fVar354;
  undefined1 auVar347 [32];
  undefined1 auVar355 [16];
  float fVar359;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar360;
  float fVar363;
  float fVar364;
  undefined1 auVar361 [16];
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar362 [32];
  float fVar370;
  float fVar378;
  float fVar381;
  undefined1 auVar373 [16];
  float fVar371;
  float fVar379;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar374 [32];
  float fVar372;
  float fVar380;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar396;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  undefined1 auVar397 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_bc0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined8 *local_9f0;
  ulong local_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar358 [64];
  
  PVar4 = prim[1];
  uVar82 = (ulong)(byte)PVar4;
  auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar138 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar142 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar142 = vinsertps_avx(auVar142,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar250 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar138 = vsubps_avx(auVar138,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar176._0_4_ = fVar250 * auVar138._0_4_;
  auVar176._4_4_ = fVar250 * auVar138._4_4_;
  auVar176._8_4_ = fVar250 * auVar138._8_4_;
  auVar176._12_4_ = fVar250 * auVar138._12_4_;
  auVar306._0_4_ = fVar250 * auVar142._0_4_;
  auVar306._4_4_ = fVar250 * auVar142._4_4_;
  auVar306._8_4_ = fVar250 * auVar142._8_4_;
  auVar306._12_4_ = fVar250 * auVar142._12_4_;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar199 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar82 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar86 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar82 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar86 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar92 = vshufps_avx(auVar306,auVar306,0);
  auVar136 = vshufps_avx(auVar306,auVar306,0x55);
  auVar177 = vshufps_avx(auVar306,auVar306,0xaa);
  fVar250 = auVar177._0_4_;
  fVar194 = auVar177._4_4_;
  fVar268 = auVar177._8_4_;
  fVar213 = auVar177._12_4_;
  fVar278 = auVar136._0_4_;
  fVar290 = auVar136._4_4_;
  fVar293 = auVar136._8_4_;
  fVar296 = auVar136._12_4_;
  fVar270 = auVar92._0_4_;
  fVar214 = auVar92._4_4_;
  fVar272 = auVar92._8_4_;
  fVar215 = auVar92._12_4_;
  auVar361._0_4_ = fVar270 * auVar138._0_4_ + fVar278 * auVar142._0_4_ + fVar250 * auVar98._0_4_;
  auVar361._4_4_ = fVar214 * auVar138._4_4_ + fVar290 * auVar142._4_4_ + fVar194 * auVar98._4_4_;
  auVar361._8_4_ = fVar272 * auVar138._8_4_ + fVar293 * auVar142._8_4_ + fVar268 * auVar98._8_4_;
  auVar361._12_4_ = fVar215 * auVar138._12_4_ + fVar296 * auVar142._12_4_ + fVar213 * auVar98._12_4_
  ;
  auVar373._0_4_ = fVar270 * auVar180._0_4_ + fVar278 * auVar199._0_4_ + auVar15._0_4_ * fVar250;
  auVar373._4_4_ = fVar214 * auVar180._4_4_ + fVar290 * auVar199._4_4_ + auVar15._4_4_ * fVar194;
  auVar373._8_4_ = fVar272 * auVar180._8_4_ + fVar293 * auVar199._8_4_ + auVar15._8_4_ * fVar268;
  auVar373._12_4_ = fVar215 * auVar180._12_4_ + fVar296 * auVar199._12_4_ + auVar15._12_4_ * fVar213
  ;
  auVar307._0_4_ = fVar270 * auVar93._0_4_ + fVar278 * auVar94._0_4_ + auVar137._0_4_ * fVar250;
  auVar307._4_4_ = fVar214 * auVar93._4_4_ + fVar290 * auVar94._4_4_ + auVar137._4_4_ * fVar194;
  auVar307._8_4_ = fVar272 * auVar93._8_4_ + fVar293 * auVar94._8_4_ + auVar137._8_4_ * fVar268;
  auVar307._12_4_ = fVar215 * auVar93._12_4_ + fVar296 * auVar94._12_4_ + auVar137._12_4_ * fVar213;
  auVar92 = vshufps_avx(auVar176,auVar176,0);
  auVar136 = vshufps_avx(auVar176,auVar176,0x55);
  auVar177 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar250 = auVar177._0_4_;
  fVar194 = auVar177._4_4_;
  fVar268 = auVar177._8_4_;
  fVar213 = auVar177._12_4_;
  fVar278 = auVar136._0_4_;
  fVar290 = auVar136._4_4_;
  fVar293 = auVar136._8_4_;
  fVar296 = auVar136._12_4_;
  fVar270 = auVar92._0_4_;
  fVar214 = auVar92._4_4_;
  fVar272 = auVar92._8_4_;
  fVar215 = auVar92._12_4_;
  auVar222._0_4_ = fVar270 * auVar138._0_4_ + fVar278 * auVar142._0_4_ + fVar250 * auVar98._0_4_;
  auVar222._4_4_ = fVar214 * auVar138._4_4_ + fVar290 * auVar142._4_4_ + fVar194 * auVar98._4_4_;
  auVar222._8_4_ = fVar272 * auVar138._8_4_ + fVar293 * auVar142._8_4_ + fVar268 * auVar98._8_4_;
  auVar222._12_4_ = fVar215 * auVar138._12_4_ + fVar296 * auVar142._12_4_ + fVar213 * auVar98._12_4_
  ;
  auVar136._0_4_ = fVar270 * auVar180._0_4_ + auVar15._0_4_ * fVar250 + fVar278 * auVar199._0_4_;
  auVar136._4_4_ = fVar214 * auVar180._4_4_ + auVar15._4_4_ * fVar194 + fVar290 * auVar199._4_4_;
  auVar136._8_4_ = fVar272 * auVar180._8_4_ + auVar15._8_4_ * fVar268 + fVar293 * auVar199._8_4_;
  auVar136._12_4_ = fVar215 * auVar180._12_4_ + auVar15._12_4_ * fVar213 + fVar296 * auVar199._12_4_
  ;
  auVar92._0_4_ = fVar270 * auVar93._0_4_ + fVar278 * auVar94._0_4_ + auVar137._0_4_ * fVar250;
  auVar92._4_4_ = fVar214 * auVar93._4_4_ + fVar290 * auVar94._4_4_ + auVar137._4_4_ * fVar194;
  auVar92._8_4_ = fVar272 * auVar93._8_4_ + fVar293 * auVar94._8_4_ + auVar137._8_4_ * fVar268;
  auVar92._12_4_ = fVar215 * auVar93._12_4_ + fVar296 * auVar94._12_4_ + auVar137._12_4_ * fVar213;
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar138 = vandps_avx(auVar361,auVar281);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  auVar138 = vcmpps_avx(auVar138,auVar195,1);
  auVar142 = vblendvps_avx(auVar361,auVar195,auVar138);
  auVar138 = vandps_avx(auVar373,auVar281);
  auVar138 = vcmpps_avx(auVar138,auVar195,1);
  auVar98 = vblendvps_avx(auVar373,auVar195,auVar138);
  auVar138 = vandps_avx(auVar307,auVar281);
  auVar138 = vcmpps_avx(auVar138,auVar195,1);
  auVar138 = vblendvps_avx(auVar307,auVar195,auVar138);
  auVar180 = vrcpps_avx(auVar142);
  fVar278 = auVar180._0_4_;
  auVar177._0_4_ = fVar278 * auVar142._0_4_;
  fVar290 = auVar180._4_4_;
  auVar177._4_4_ = fVar290 * auVar142._4_4_;
  fVar293 = auVar180._8_4_;
  auVar177._8_4_ = fVar293 * auVar142._8_4_;
  fVar296 = auVar180._12_4_;
  auVar177._12_4_ = fVar296 * auVar142._12_4_;
  auVar308._8_4_ = 0x3f800000;
  auVar308._0_8_ = &DAT_3f8000003f800000;
  auVar308._12_4_ = 0x3f800000;
  auVar142 = vsubps_avx(auVar308,auVar177);
  fVar278 = fVar278 + fVar278 * auVar142._0_4_;
  fVar290 = fVar290 + fVar290 * auVar142._4_4_;
  fVar293 = fVar293 + fVar293 * auVar142._8_4_;
  fVar296 = fVar296 + fVar296 * auVar142._12_4_;
  auVar142 = vrcpps_avx(auVar98);
  fVar250 = auVar142._0_4_;
  auVar252._0_4_ = fVar250 * auVar98._0_4_;
  fVar268 = auVar142._4_4_;
  auVar252._4_4_ = fVar268 * auVar98._4_4_;
  fVar270 = auVar142._8_4_;
  auVar252._8_4_ = fVar270 * auVar98._8_4_;
  fVar272 = auVar142._12_4_;
  auVar252._12_4_ = fVar272 * auVar98._12_4_;
  auVar142 = vsubps_avx(auVar308,auVar252);
  fVar250 = fVar250 + fVar250 * auVar142._0_4_;
  fVar268 = fVar268 + fVar268 * auVar142._4_4_;
  fVar270 = fVar270 + fVar270 * auVar142._8_4_;
  fVar272 = fVar272 + fVar272 * auVar142._12_4_;
  auVar142 = vrcpps_avx(auVar138);
  fVar194 = auVar142._0_4_;
  auVar196._0_4_ = fVar194 * auVar138._0_4_;
  fVar213 = auVar142._4_4_;
  auVar196._4_4_ = fVar213 * auVar138._4_4_;
  fVar214 = auVar142._8_4_;
  auVar196._8_4_ = fVar214 * auVar138._8_4_;
  fVar215 = auVar142._12_4_;
  auVar196._12_4_ = fVar215 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar308,auVar196);
  fVar194 = fVar194 + fVar194 * auVar138._0_4_;
  fVar213 = fVar213 + fVar213 * auVar138._4_4_;
  fVar214 = fVar214 + fVar214 * auVar138._8_4_;
  fVar215 = fVar215 + fVar215 * auVar138._12_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar138 = vpmovsxwd_avx(auVar138);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar222);
  auVar178._0_4_ = fVar278 * auVar138._0_4_;
  auVar178._4_4_ = fVar290 * auVar138._4_4_;
  auVar178._8_4_ = fVar293 * auVar138._8_4_;
  auVar178._12_4_ = fVar296 * auVar138._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar138 = vpmovsxwd_avx(auVar142);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar222);
  auVar223._0_4_ = fVar278 * auVar138._0_4_;
  auVar223._4_4_ = fVar290 * auVar138._4_4_;
  auVar223._8_4_ = fVar293 * auVar138._8_4_;
  auVar223._12_4_ = fVar296 * auVar138._12_4_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar142 = vpmovsxwd_avx(auVar98);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar82 * -2 + 6);
  auVar138 = vpmovsxwd_avx(auVar180);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar136);
  auVar327._0_4_ = auVar138._0_4_ * fVar250;
  auVar327._4_4_ = auVar138._4_4_ * fVar268;
  auVar327._8_4_ = auVar138._8_4_ * fVar270;
  auVar327._12_4_ = auVar138._12_4_ * fVar272;
  auVar138 = vcvtdq2ps_avx(auVar142);
  auVar138 = vsubps_avx(auVar138,auVar136);
  auVar137._0_4_ = fVar250 * auVar138._0_4_;
  auVar137._4_4_ = fVar268 * auVar138._4_4_;
  auVar137._8_4_ = fVar270 * auVar138._8_4_;
  auVar137._12_4_ = fVar272 * auVar138._12_4_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar86 + uVar82 + 6);
  auVar138 = vpmovsxwd_avx(auVar199);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar92);
  auVar253._0_4_ = auVar138._0_4_ * fVar194;
  auVar253._4_4_ = auVar138._4_4_ * fVar213;
  auVar253._8_4_ = auVar138._8_4_ * fVar214;
  auVar253._12_4_ = auVar138._12_4_ * fVar215;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar138 = vpmovsxwd_avx(auVar15);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar92);
  auVar93._0_4_ = auVar138._0_4_ * fVar194;
  auVar93._4_4_ = auVar138._4_4_ * fVar213;
  auVar93._8_4_ = auVar138._8_4_ * fVar214;
  auVar93._12_4_ = auVar138._12_4_ * fVar215;
  auVar138 = vpminsd_avx(auVar178,auVar223);
  auVar142 = vpminsd_avx(auVar327,auVar137);
  auVar138 = vmaxps_avx(auVar138,auVar142);
  auVar142 = vpminsd_avx(auVar253,auVar93);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar336._4_4_ = uVar2;
  auVar336._0_4_ = uVar2;
  auVar336._8_4_ = uVar2;
  auVar336._12_4_ = uVar2;
  auVar142 = vmaxps_avx(auVar142,auVar336);
  auVar138 = vmaxps_avx(auVar138,auVar142);
  local_4d0._0_4_ = auVar138._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar138._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar138._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar138._12_4_ * 0.99999964;
  auVar138 = vpmaxsd_avx(auVar178,auVar223);
  auVar142 = vpmaxsd_avx(auVar327,auVar137);
  auVar138 = vminps_avx(auVar138,auVar142);
  auVar142 = vpmaxsd_avx(auVar253,auVar93);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar179._4_4_ = uVar2;
  auVar179._0_4_ = uVar2;
  auVar179._8_4_ = uVar2;
  auVar179._12_4_ = uVar2;
  auVar142 = vminps_avx(auVar142,auVar179);
  auVar138 = vminps_avx(auVar138,auVar142);
  auVar94._0_4_ = auVar138._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar138._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar138._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar138._12_4_ * 1.0000004;
  auVar138 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar142 = vpcmpgtd_avx(auVar138,_DAT_01ff0cf0);
  auVar138 = vcmpps_avx(local_4d0,auVar94,2);
  auVar138 = vandps_avx(auVar138,auVar142);
  uVar81 = vmovmskps_avx(auVar138);
  if (uVar81 == 0) {
    return;
  }
  uVar81 = uVar81 & 0xff;
  auVar107._16_16_ = mm_lookupmask_ps._240_16_;
  auVar107._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
  local_9f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_00f1cf91:
  local_8a8 = (ulong)uVar81;
  lVar83 = 0;
  if (local_8a8 != 0) {
    for (; (uVar81 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
    }
  }
  uVar81 = *(uint *)(local_8b0 + 2);
  local_9e8 = (ulong)*(uint *)(local_8b0 + lVar83 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar81].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_9e8 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar138 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar86);
  auVar142 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * (uVar86 + 1));
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar180 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar250 = *(float *)(ray + k * 4 + 0x40);
  auVar337._4_4_ = fVar250;
  auVar337._0_4_ = fVar250;
  auVar337._8_4_ = fVar250;
  auVar337._12_4_ = fVar250;
  fStack_7b0 = fVar250;
  _local_7c0 = auVar337;
  fStack_7ac = fVar250;
  fStack_7a8 = fVar250;
  fStack_7a4 = fVar250;
  fVar194 = *(float *)(ray + k * 4 + 0x50);
  auVar345._4_4_ = fVar194;
  auVar345._0_4_ = fVar194;
  auVar345._8_4_ = fVar194;
  auVar345._12_4_ = fVar194;
  fStack_7d0 = fVar194;
  _local_7e0 = auVar345;
  fStack_7cc = fVar194;
  fStack_7c8 = fVar194;
  fStack_7c4 = fVar194;
  auVar98 = vunpcklps_avx(auVar337,auVar345);
  fVar268 = *(float *)(ray + k * 4 + 0x60);
  auVar355._4_4_ = fVar268;
  auVar355._0_4_ = fVar268;
  auVar355._8_4_ = fVar268;
  auVar355._12_4_ = fVar268;
  fStack_7f0 = fVar268;
  _local_800 = auVar355;
  fStack_7ec = fVar268;
  fStack_7e8 = fVar268;
  fStack_7e4 = fVar268;
  auVar358 = ZEXT3264(_local_800);
  _local_910 = vinsertps_avx(auVar98,auVar355,0x28);
  pfVar1 = (float *)(pGVar5[2].intersectionFilterN + uVar86 * (long)pGVar5[2].pointQueryFunc);
  auVar224._0_4_ = auVar138._0_4_ + *pfVar1 * 0.33333334;
  auVar224._4_4_ = auVar138._4_4_ + pfVar1[1] * 0.33333334;
  auVar224._8_4_ = auVar138._8_4_ + pfVar1[2] * 0.33333334;
  auVar224._12_4_ = auVar138._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * (uVar86 + 1));
  auVar95._0_4_ = *pfVar1 * 0.33333334;
  auVar95._4_4_ = pfVar1[1] * 0.33333334;
  auVar95._8_4_ = pfVar1[2] * 0.33333334;
  auVar95._12_4_ = pfVar1[3] * 0.33333334;
  auVar15 = vsubps_avx(auVar142,auVar95);
  auVar96._0_4_ = (auVar142._0_4_ + auVar138._0_4_ + auVar224._0_4_ + auVar15._0_4_) * 0.25;
  auVar96._4_4_ = (auVar142._4_4_ + auVar138._4_4_ + auVar224._4_4_ + auVar15._4_4_) * 0.25;
  auVar96._8_4_ = (auVar142._8_4_ + auVar138._8_4_ + auVar224._8_4_ + auVar15._8_4_) * 0.25;
  auVar96._12_4_ = (auVar142._12_4_ + auVar138._12_4_ + auVar224._12_4_ + auVar15._12_4_) * 0.25;
  auVar98 = vsubps_avx(auVar96,auVar180);
  auVar98 = vdpps_avx(auVar98,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar199 = vrcpss_avx(local_920,local_920);
  fVar213 = auVar98._0_4_ * auVar199._0_4_ * (2.0 - local_920._0_4_ * auVar199._0_4_);
  auVar199 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
  auVar197._0_4_ = auVar180._0_4_ + local_910._0_4_ * auVar199._0_4_;
  auVar197._4_4_ = auVar180._4_4_ + local_910._4_4_ * auVar199._4_4_;
  auVar197._8_4_ = auVar180._8_4_ + local_910._8_4_ * auVar199._8_4_;
  auVar197._12_4_ = auVar180._12_4_ + local_910._12_4_ * auVar199._12_4_;
  auVar98 = vblendps_avx(auVar197,_DAT_01feba10,8);
  _local_a60 = vsubps_avx(auVar138,auVar98);
  _local_a70 = vsubps_avx(auVar15,auVar98);
  _local_a80 = vsubps_avx(auVar224,auVar98);
  auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  _local_a90 = vsubps_avx(auVar142,auVar98);
  auVar212 = ZEXT1664(_local_a90);
  auVar138 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001250 = auVar138;
  _local_1a0 = auVar138;
  auVar138 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001250 = auVar138;
  _local_1c0 = auVar138;
  auVar138 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001250 = auVar138;
  _local_1e0 = auVar138;
  auVar138 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar138;
  _local_200 = auVar138;
  auVar138 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar138;
  _local_220 = auVar138;
  auVar138 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar138;
  _local_240 = auVar138;
  auVar138 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar138;
  _local_260 = auVar138;
  auVar138 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar138;
  _local_280 = auVar138;
  auVar138 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar138;
  _local_2a0 = auVar138;
  auVar138 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar138;
  _local_2c0 = auVar138;
  auVar138 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar138;
  _local_2e0 = auVar138;
  auVar138 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar138;
  _local_300 = auVar138;
  auVar138 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar138;
  _local_320 = auVar138;
  auVar138 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar138;
  _local_340 = auVar138;
  auVar138 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar138;
  _local_360 = auVar138;
  auVar138 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar138;
  _local_380 = auVar138;
  auVar138 = ZEXT416((uint)(fVar250 * fVar250 + fVar194 * fVar194 + fVar268 * fVar268));
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  local_3a0._16_16_ = auVar138;
  local_3a0._0_16_ = auVar138;
  fVar250 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar213);
  auVar138 = vshufps_avx(ZEXT416((uint)(fVar250 - fVar213)),ZEXT416((uint)(fVar250 - fVar213)),0);
  local_3e0._16_16_ = auVar138;
  local_3e0._0_16_ = auVar138;
  local_710 = vpshufd_avx(ZEXT416(uVar81),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar83 * 4 + 6)),0);
  register0x00001390 = auVar199;
  _local_900 = auVar199;
  auVar289 = ZEXT3264(_local_900);
  uVar82 = 0;
  uVar86 = 1;
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_3a0,auVar108);
  auVar138 = vsqrtss_avx(local_920,local_920);
  local_b04 = auVar138._0_4_;
  auVar138 = vsqrtss_avx(local_920,local_920);
  local_b08 = auVar138._0_4_;
  auVar314 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_a00 = auVar314._0_16_;
    auVar138 = vmovshdup_avx(local_a00);
    fVar194 = auVar138._0_4_ - auVar314._0_4_;
    auVar138 = vshufps_avx(local_a00,local_a00,0);
    local_9c0._16_16_ = auVar138;
    local_9c0._0_16_ = auVar138;
    auVar142 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
    local_740._16_16_ = auVar142;
    local_740._0_16_ = auVar142;
    fVar135 = auVar142._0_4_;
    fVar168 = auVar142._4_4_;
    fVar169 = auVar142._8_4_;
    fVar171 = auVar142._12_4_;
    fVar89 = auVar138._0_4_;
    auVar152._0_4_ = fVar89 + fVar135 * 0.0;
    fVar118 = auVar138._4_4_;
    auVar152._4_4_ = fVar118 + fVar168 * 0.14285715;
    fVar121 = auVar138._8_4_;
    auVar152._8_4_ = fVar121 + fVar169 * 0.2857143;
    fVar124 = auVar138._12_4_;
    auVar152._12_4_ = fVar124 + fVar171 * 0.42857146;
    auVar152._16_4_ = fVar89 + fVar135 * 0.5714286;
    auVar152._20_4_ = fVar118 + fVar168 * 0.71428573;
    auVar152._24_4_ = fVar121 + fVar169 * 0.8571429;
    auVar152._28_4_ = fVar124 + fVar171;
    auVar107 = vsubps_avx(auVar238._0_32_,auVar152);
    fVar268 = auVar107._0_4_;
    fVar213 = auVar107._4_4_;
    fVar270 = auVar107._8_4_;
    fVar214 = auVar107._12_4_;
    fVar272 = auVar107._16_4_;
    fVar215 = auVar107._20_4_;
    fVar278 = auVar107._24_4_;
    fVar220 = auVar212._28_4_;
    fVar279 = (float)local_2a0._0_4_ * auVar152._0_4_ + (float)local_220._0_4_ * fVar268;
    fVar291 = (float)local_2a0._4_4_ * auVar152._4_4_ + (float)local_220._4_4_ * fVar213;
    fVar294 = fStack_298 * auVar152._8_4_ + fStack_218 * fVar270;
    fVar297 = fStack_294 * auVar152._12_4_ + fStack_214 * fVar214;
    fVar299 = fStack_290 * auVar152._16_4_ + fStack_210 * fVar272;
    fVar301 = fStack_28c * auVar152._20_4_ + fStack_20c * fVar215;
    fVar303 = fStack_288 * auVar152._24_4_ + fStack_208 * fVar278;
    fVar290 = (float)local_2c0._0_4_ * auVar152._0_4_ + (float)local_240._0_4_ * fVar268;
    fVar293 = (float)local_2c0._4_4_ * auVar152._4_4_ + (float)local_240._4_4_ * fVar213;
    fVar296 = fStack_2b8 * auVar152._8_4_ + fStack_238 * fVar270;
    fVar216 = fStack_2b4 * auVar152._12_4_ + fStack_234 * fVar214;
    fVar217 = fStack_2b0 * auVar152._16_4_ + fStack_230 * fVar272;
    fVar218 = fStack_2ac * auVar152._20_4_ + fStack_22c * fVar215;
    fVar219 = fStack_2a8 * auVar152._24_4_ + fStack_228 * fVar278;
    fVar221 = (float)local_2e0._0_4_ * auVar152._0_4_ + (float)local_260._0_4_ * fVar268;
    fVar239 = (float)local_2e0._4_4_ * auVar152._4_4_ + (float)local_260._4_4_ * fVar213;
    fVar240 = fStack_2d8 * auVar152._8_4_ + fStack_258 * fVar270;
    fVar242 = fStack_2d4 * auVar152._12_4_ + fStack_254 * fVar214;
    fVar244 = fStack_2d0 * auVar152._16_4_ + fStack_250 * fVar272;
    fVar246 = fStack_2cc * auVar152._20_4_ + fStack_24c * fVar215;
    fVar248 = fStack_2c8 * auVar152._24_4_ + fStack_248 * fVar278;
    fVar251 = (float)local_300._0_4_ * auVar152._0_4_ + (float)local_280._0_4_ * fVar268;
    fVar269 = (float)local_300._4_4_ * auVar152._4_4_ + (float)local_280._4_4_ * fVar213;
    fVar271 = fStack_2f8 * auVar152._8_4_ + fStack_278 * fVar270;
    fVar273 = fStack_2f4 * auVar152._12_4_ + fStack_274 * fVar214;
    fVar274 = fStack_2f0 * auVar152._16_4_ + fStack_270 * fVar272;
    fVar275 = fStack_2ec * auVar152._20_4_ + fStack_26c * fVar215;
    fVar276 = fStack_2e8 * auVar152._24_4_ + fStack_268 * fVar278;
    fVar359 = auVar358._28_4_;
    fVar391 = fVar359 + fStack_224;
    fVar369 = fStack_204 + fVar359;
    auVar340._0_4_ =
         ((float)local_220._0_4_ * auVar152._0_4_ + fVar268 * (float)local_1a0._0_4_) * fVar268 +
         auVar152._0_4_ * fVar279;
    auVar340._4_4_ =
         ((float)local_220._4_4_ * auVar152._4_4_ + fVar213 * (float)local_1a0._4_4_) * fVar213 +
         auVar152._4_4_ * fVar291;
    auVar340._8_4_ =
         (fStack_218 * auVar152._8_4_ + fVar270 * fStack_198) * fVar270 + auVar152._8_4_ * fVar294;
    auVar340._12_4_ =
         (fStack_214 * auVar152._12_4_ + fVar214 * fStack_194) * fVar214 + auVar152._12_4_ * fVar297
    ;
    auVar340._16_4_ =
         (fStack_210 * auVar152._16_4_ + fVar272 * fStack_190) * fVar272 + auVar152._16_4_ * fVar299
    ;
    auVar340._20_4_ =
         (fStack_20c * auVar152._20_4_ + fVar215 * fStack_18c) * fVar215 + auVar152._20_4_ * fVar301
    ;
    auVar340._24_4_ =
         (fStack_208 * auVar152._24_4_ + fVar278 * fStack_188) * fVar278 + auVar152._24_4_ * fVar303
    ;
    auVar340._28_4_ = fStack_2e4 + fVar359;
    auVar346._0_4_ =
         fVar268 * ((float)local_240._0_4_ * auVar152._0_4_ + fVar268 * (float)local_1c0._0_4_) +
         auVar152._0_4_ * fVar290;
    auVar346._4_4_ =
         fVar213 * ((float)local_240._4_4_ * auVar152._4_4_ + fVar213 * (float)local_1c0._4_4_) +
         auVar152._4_4_ * fVar293;
    auVar346._8_4_ =
         fVar270 * (fStack_238 * auVar152._8_4_ + fVar270 * fStack_1b8) + auVar152._8_4_ * fVar296;
    auVar346._12_4_ =
         fVar214 * (fStack_234 * auVar152._12_4_ + fVar214 * fStack_1b4) + auVar152._12_4_ * fVar216
    ;
    auVar346._16_4_ =
         fVar272 * (fStack_230 * auVar152._16_4_ + fVar272 * fStack_1b0) + auVar152._16_4_ * fVar217
    ;
    auVar346._20_4_ =
         fVar215 * (fStack_22c * auVar152._20_4_ + fVar215 * fStack_1ac) + auVar152._20_4_ * fVar218
    ;
    auVar346._24_4_ =
         fVar278 * (fStack_228 * auVar152._24_4_ + fVar278 * fStack_1a8) + auVar152._24_4_ * fVar219
    ;
    auVar346._28_4_ = fVar220 + auVar314._28_4_ + fVar359;
    auVar356._0_4_ =
         fVar268 * ((float)local_260._0_4_ * auVar152._0_4_ + fVar268 * (float)local_1e0._0_4_) +
         auVar152._0_4_ * fVar221;
    auVar356._4_4_ =
         fVar213 * ((float)local_260._4_4_ * auVar152._4_4_ + fVar213 * (float)local_1e0._4_4_) +
         auVar152._4_4_ * fVar239;
    auVar356._8_4_ =
         fVar270 * (fStack_258 * auVar152._8_4_ + fVar270 * fStack_1d8) + auVar152._8_4_ * fVar240;
    auVar356._12_4_ =
         fVar214 * (fStack_254 * auVar152._12_4_ + fVar214 * fStack_1d4) + auVar152._12_4_ * fVar242
    ;
    auVar356._16_4_ =
         fVar272 * (fStack_250 * auVar152._16_4_ + fVar272 * fStack_1d0) + auVar152._16_4_ * fVar244
    ;
    auVar356._20_4_ =
         fVar215 * (fStack_24c * auVar152._20_4_ + fVar215 * fStack_1cc) + auVar152._20_4_ * fVar246
    ;
    auVar356._24_4_ =
         fVar278 * (fStack_248 * auVar152._24_4_ + fVar278 * fStack_1c8) + auVar152._24_4_ * fVar248
    ;
    auVar356._28_4_ = fStack_2c4 + fVar359;
    auVar309._0_4_ =
         auVar152._0_4_ * fVar251 +
         fVar268 * ((float)local_280._0_4_ * auVar152._0_4_ + fVar268 * (float)local_200._0_4_);
    auVar309._4_4_ =
         auVar152._4_4_ * fVar269 +
         fVar213 * ((float)local_280._4_4_ * auVar152._4_4_ + fVar213 * (float)local_200._4_4_);
    auVar309._8_4_ =
         auVar152._8_4_ * fVar271 + fVar270 * (fStack_278 * auVar152._8_4_ + fVar270 * fStack_1f8);
    auVar309._12_4_ =
         auVar152._12_4_ * fVar273 + fVar214 * (fStack_274 * auVar152._12_4_ + fVar214 * fStack_1f4)
    ;
    auVar309._16_4_ =
         auVar152._16_4_ * fVar274 + fVar272 * (fStack_270 * auVar152._16_4_ + fVar272 * fStack_1f0)
    ;
    auVar309._20_4_ =
         auVar152._20_4_ * fVar275 + fVar215 * (fStack_26c * auVar152._20_4_ + fVar215 * fStack_1ec)
    ;
    auVar309._24_4_ =
         auVar152._24_4_ * fVar276 + fVar278 * (fStack_268 * auVar152._24_4_ + fVar278 * fStack_1e8)
    ;
    auVar309._28_4_ = fStack_2c4 + fStack_2a4;
    auVar392._0_4_ =
         (auVar152._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar268) *
         auVar152._0_4_ + fVar268 * fVar279;
    auVar392._4_4_ =
         (auVar152._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar213) *
         auVar152._4_4_ + fVar213 * fVar291;
    auVar392._8_4_ =
         (auVar152._8_4_ * fStack_318 + fStack_298 * fVar270) * auVar152._8_4_ + fVar270 * fVar294;
    auVar392._12_4_ =
         (auVar152._12_4_ * fStack_314 + fStack_294 * fVar214) * auVar152._12_4_ + fVar214 * fVar297
    ;
    auVar392._16_4_ =
         (auVar152._16_4_ * fStack_310 + fStack_290 * fVar272) * auVar152._16_4_ + fVar272 * fVar299
    ;
    auVar392._20_4_ =
         (auVar152._20_4_ * fStack_30c + fStack_28c * fVar215) * auVar152._20_4_ + fVar215 * fVar301
    ;
    auVar392._24_4_ =
         (auVar152._24_4_ * fStack_308 + fStack_288 * fVar278) * auVar152._24_4_ + fVar278 * fVar303
    ;
    auVar392._28_4_ = fStack_2c4 + fVar220 + auVar289._28_4_;
    auVar206._0_4_ =
         (auVar152._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar268) *
         auVar152._0_4_ + fVar268 * fVar290;
    auVar206._4_4_ =
         (auVar152._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar213) *
         auVar152._4_4_ + fVar213 * fVar293;
    auVar206._8_4_ =
         (auVar152._8_4_ * fStack_338 + fStack_2b8 * fVar270) * auVar152._8_4_ + fVar270 * fVar296;
    auVar206._12_4_ =
         (auVar152._12_4_ * fStack_334 + fStack_2b4 * fVar214) * auVar152._12_4_ + fVar214 * fVar216
    ;
    auVar206._16_4_ =
         (auVar152._16_4_ * fStack_330 + fStack_2b0 * fVar272) * auVar152._16_4_ + fVar272 * fVar217
    ;
    auVar206._20_4_ =
         (auVar152._20_4_ * fStack_32c + fStack_2ac * fVar215) * auVar152._20_4_ + fVar215 * fVar218
    ;
    auVar206._24_4_ =
         (auVar152._24_4_ * fStack_328 + fStack_2a8 * fVar278) * auVar152._24_4_ + fVar278 * fVar219
    ;
    auVar206._28_4_ = fStack_2c4 + auVar238._28_4_ + fVar220;
    auVar234._0_4_ =
         auVar152._0_4_ *
         (auVar152._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar268) +
         fVar268 * fVar221;
    auVar234._4_4_ =
         auVar152._4_4_ *
         (auVar152._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar213) +
         fVar213 * fVar239;
    auVar234._8_4_ =
         auVar152._8_4_ * (auVar152._8_4_ * fStack_358 + fStack_2d8 * fVar270) + fVar270 * fVar240;
    auVar234._12_4_ =
         auVar152._12_4_ * (auVar152._12_4_ * fStack_354 + fStack_2d4 * fVar214) + fVar214 * fVar242
    ;
    auVar234._16_4_ =
         auVar152._16_4_ * (auVar152._16_4_ * fStack_350 + fStack_2d0 * fVar272) + fVar272 * fVar244
    ;
    auVar234._20_4_ =
         auVar152._20_4_ * (auVar152._20_4_ * fStack_34c + fStack_2cc * fVar215) + fVar215 * fVar246
    ;
    auVar234._24_4_ =
         auVar152._24_4_ * (auVar152._24_4_ * fStack_348 + fStack_2c8 * fVar278) + fVar278 * fVar248
    ;
    auVar234._28_4_ = fVar369 + auVar238._28_4_ + 1.0;
    auVar260._0_4_ =
         (auVar152._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar268) *
         auVar152._0_4_ + fVar268 * fVar251;
    auVar260._4_4_ =
         (auVar152._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar213) *
         auVar152._4_4_ + fVar213 * fVar269;
    auVar260._8_4_ =
         (auVar152._8_4_ * fStack_378 + fStack_2f8 * fVar270) * auVar152._8_4_ + fVar270 * fVar271;
    auVar260._12_4_ =
         (auVar152._12_4_ * fStack_374 + fStack_2f4 * fVar214) * auVar152._12_4_ + fVar214 * fVar273
    ;
    auVar260._16_4_ =
         (auVar152._16_4_ * fStack_370 + fStack_2f0 * fVar272) * auVar152._16_4_ + fVar272 * fVar274
    ;
    auVar260._20_4_ =
         (auVar152._20_4_ * fStack_36c + fStack_2ec * fVar215) * auVar152._20_4_ + fVar215 * fVar275
    ;
    auVar260._24_4_ =
         (auVar152._24_4_ * fStack_368 + fStack_2e8 * fVar278) * auVar152._24_4_ + fVar278 * fVar276
    ;
    auVar260._28_4_ = fVar391 + fVar359 + 1.0;
    fVar90 = auVar340._0_4_ * fVar268 + auVar392._0_4_ * auVar152._0_4_;
    fVar119 = auVar340._4_4_ * fVar213 + auVar392._4_4_ * auVar152._4_4_;
    fVar122 = auVar340._8_4_ * fVar270 + auVar392._8_4_ * auVar152._8_4_;
    fVar125 = auVar340._12_4_ * fVar214 + auVar392._12_4_ * auVar152._12_4_;
    fVar127 = auVar340._16_4_ * fVar272 + auVar392._16_4_ * auVar152._16_4_;
    fVar129 = auVar340._20_4_ * fVar215 + auVar392._20_4_ * auVar152._20_4_;
    fVar131 = auVar340._24_4_ * fVar278 + auVar392._24_4_ * auVar152._24_4_;
    fVar133 = fVar391 + fStack_2c4;
    fVar91 = auVar346._0_4_ * fVar268 + auVar152._0_4_ * auVar206._0_4_;
    fVar120 = auVar346._4_4_ * fVar213 + auVar152._4_4_ * auVar206._4_4_;
    fVar123 = auVar346._8_4_ * fVar270 + auVar152._8_4_ * auVar206._8_4_;
    fVar126 = auVar346._12_4_ * fVar214 + auVar152._12_4_ * auVar206._12_4_;
    fVar128 = auVar346._16_4_ * fVar272 + auVar152._16_4_ * auVar206._16_4_;
    fVar130 = auVar346._20_4_ * fVar215 + auVar152._20_4_ * auVar206._20_4_;
    fVar132 = auVar346._24_4_ * fVar278 + auVar152._24_4_ * auVar206._24_4_;
    fVar134 = fStack_2c4 + fVar369;
    local_640._0_4_ = auVar356._0_4_ * fVar268 + auVar152._0_4_ * auVar234._0_4_;
    local_640._4_4_ = auVar356._4_4_ * fVar213 + auVar152._4_4_ * auVar234._4_4_;
    fStack_638 = auVar356._8_4_ * fVar270 + auVar152._8_4_ * auVar234._8_4_;
    fStack_634 = auVar356._12_4_ * fVar214 + auVar152._12_4_ * auVar234._12_4_;
    fStack_630 = auVar356._16_4_ * fVar272 + auVar152._16_4_ * auVar234._16_4_;
    fStack_62c = auVar356._20_4_ * fVar215 + auVar152._20_4_ * auVar234._20_4_;
    fStack_628 = auVar356._24_4_ * fVar278 + auVar152._24_4_ * auVar234._24_4_;
    fStack_624 = fVar369 + fStack_2c4;
    local_760._0_4_ = fVar268 * auVar309._0_4_ + auVar152._0_4_ * auVar260._0_4_;
    local_760._4_4_ = fVar213 * auVar309._4_4_ + auVar152._4_4_ * auVar260._4_4_;
    local_760._8_4_ = fVar270 * auVar309._8_4_ + auVar152._8_4_ * auVar260._8_4_;
    local_760._12_4_ = fVar214 * auVar309._12_4_ + auVar152._12_4_ * auVar260._12_4_;
    local_760._16_4_ = fVar272 * auVar309._16_4_ + auVar152._16_4_ * auVar260._16_4_;
    local_760._20_4_ = fVar215 * auVar309._20_4_ + auVar152._20_4_ * auVar260._20_4_;
    local_760._24_4_ = fVar278 * auVar309._24_4_ + auVar152._24_4_ * auVar260._24_4_;
    local_760._28_4_ = auVar107._28_4_ + auVar152._28_4_;
    auVar17 = vsubps_avx(auVar392,auVar340);
    auVar107 = vsubps_avx(auVar206,auVar346);
    auVar108 = vsubps_avx(auVar234,auVar356);
    auVar152 = vsubps_avx(auVar260,auVar309);
    auVar138 = vshufps_avx(ZEXT416((uint)(fVar194 * 0.04761905)),
                           ZEXT416((uint)(fVar194 * 0.04761905)),0);
    fVar244 = auVar138._0_4_;
    fVar305 = fVar244 * auVar17._0_4_ * 3.0;
    fVar246 = auVar138._4_4_;
    fVar315 = fVar246 * auVar17._4_4_ * 3.0;
    local_ae0._4_4_ = fVar315;
    local_ae0._0_4_ = fVar305;
    fVar274 = auVar138._8_4_;
    fVar316 = fVar274 * auVar17._8_4_ * 3.0;
    fStack_ad8 = fVar316;
    fVar219 = auVar138._12_4_;
    fVar318 = fVar219 * auVar17._12_4_ * 3.0;
    fStack_ad4 = fVar318;
    fVar320 = fVar244 * auVar17._16_4_ * 3.0;
    unique0x10007234 = fVar320;
    fVar322 = fVar246 * auVar17._20_4_ * 3.0;
    unique0x10007238 = fVar322;
    fVar324 = fVar274 * auVar17._24_4_ * 3.0;
    unique0x1000723c = fVar324;
    unique0x10007240 = auVar309._28_4_;
    fVar360 = fVar244 * auVar107._0_4_ * 3.0;
    fVar363 = fVar246 * auVar107._4_4_ * 3.0;
    local_b00._4_4_ = fVar363;
    local_b00._0_4_ = fVar360;
    fVar364 = fVar274 * auVar107._8_4_ * 3.0;
    local_b00._8_4_ = fVar364;
    fVar365 = fVar219 * auVar107._12_4_ * 3.0;
    local_b00._12_4_ = fVar365;
    fVar366 = fVar244 * auVar107._16_4_ * 3.0;
    local_b00._16_4_ = fVar366;
    fVar367 = fVar246 * auVar107._20_4_ * 3.0;
    local_b00._20_4_ = fVar367;
    fVar368 = fVar274 * auVar107._24_4_ * 3.0;
    local_b00._24_4_ = fVar368;
    local_b00._28_4_ = fVar369;
    fVar370 = fVar244 * auVar108._0_4_ * 3.0;
    fVar378 = fVar246 * auVar108._4_4_ * 3.0;
    auVar23._4_4_ = fVar378;
    auVar23._0_4_ = fVar370;
    fVar381 = fVar274 * auVar108._8_4_ * 3.0;
    auVar23._8_4_ = fVar381;
    fVar383 = fVar219 * auVar108._12_4_ * 3.0;
    auVar23._12_4_ = fVar383;
    fVar385 = fVar244 * auVar108._16_4_ * 3.0;
    auVar23._16_4_ = fVar385;
    fVar387 = fVar246 * auVar108._20_4_ * 3.0;
    auVar23._20_4_ = fVar387;
    fVar389 = fVar274 * auVar108._24_4_ * 3.0;
    auVar23._24_4_ = fVar389;
    auVar23._28_4_ = fVar391;
    fVar215 = fVar244 * auVar152._0_4_ * 3.0;
    fVar278 = fVar246 * auVar152._4_4_ * 3.0;
    auVar16._4_4_ = fVar278;
    auVar16._0_4_ = fVar215;
    fVar218 = fVar274 * auVar152._8_4_ * 3.0;
    auVar16._8_4_ = fVar218;
    fVar219 = fVar219 * auVar152._12_4_ * 3.0;
    auVar16._12_4_ = fVar219;
    fVar244 = fVar244 * auVar152._16_4_ * 3.0;
    auVar16._16_4_ = fVar244;
    fVar246 = fVar246 * auVar152._20_4_ * 3.0;
    auVar16._20_4_ = fVar246;
    fVar274 = fVar274 * auVar152._24_4_ * 3.0;
    auVar16._24_4_ = fVar274;
    auVar16._28_4_ = auVar17._28_4_;
    auVar73._4_4_ = fVar120;
    auVar73._0_4_ = fVar91;
    auVar73._8_4_ = fVar123;
    auVar73._12_4_ = fVar126;
    auVar73._16_4_ = fVar128;
    auVar73._20_4_ = fVar130;
    auVar73._24_4_ = fVar132;
    auVar73._28_4_ = fVar134;
    auVar107 = vperm2f128_avx(auVar73,auVar73,1);
    auVar107 = vshufps_avx(auVar107,auVar73,0x30);
    auVar152 = vshufps_avx(auVar73,auVar107,0x29);
    auVar107 = vperm2f128_avx(_local_640,_local_640,1);
    auVar107 = vshufps_avx(auVar107,_local_640,0x30);
    local_a20 = vshufps_avx(_local_640,auVar107,0x29);
    auVar108 = vsubps_avx(local_760,auVar16);
    auVar107 = vperm2f128_avx(auVar108,auVar108,1);
    auVar107 = vshufps_avx(auVar107,auVar108,0x30);
    local_780 = vshufps_avx(auVar108,auVar107,0x29);
    local_560 = vsubps_avx(auVar152,auVar73);
    local_540 = vsubps_avx(local_a20,_local_640);
    fVar268 = local_560._0_4_;
    fVar290 = local_560._4_4_;
    auVar377._4_4_ = fVar378 * fVar290;
    auVar377._0_4_ = fVar370 * fVar268;
    fVar220 = local_560._8_4_;
    auVar377._8_4_ = fVar381 * fVar220;
    fVar248 = local_560._12_4_;
    auVar377._12_4_ = fVar383 * fVar248;
    fVar276 = local_560._16_4_;
    auVar377._16_4_ = fVar385 * fVar276;
    fVar303 = local_560._20_4_;
    auVar377._20_4_ = fVar387 * fVar303;
    fVar10 = local_560._24_4_;
    auVar377._24_4_ = fVar389 * fVar10;
    auVar377._28_4_ = auVar108._28_4_;
    fVar213 = local_540._0_4_;
    fVar293 = local_540._4_4_;
    auVar18._4_4_ = fVar363 * fVar293;
    auVar18._0_4_ = fVar360 * fVar213;
    fVar221 = local_540._8_4_;
    auVar18._8_4_ = fVar364 * fVar221;
    fVar251 = local_540._12_4_;
    auVar18._12_4_ = fVar365 * fVar251;
    fVar279 = local_540._16_4_;
    auVar18._16_4_ = fVar366 * fVar279;
    fVar359 = local_540._20_4_;
    auVar18._20_4_ = fVar367 * fVar359;
    fVar11 = local_540._24_4_;
    auVar18._24_4_ = fVar368 * fVar11;
    auVar18._28_4_ = auVar107._28_4_;
    auVar377 = vsubps_avx(auVar18,auVar377);
    auVar71._4_4_ = fVar119;
    auVar71._0_4_ = fVar90;
    auVar71._8_4_ = fVar122;
    auVar71._12_4_ = fVar125;
    auVar71._16_4_ = fVar127;
    auVar71._20_4_ = fVar129;
    auVar71._24_4_ = fVar131;
    auVar71._28_4_ = fVar133;
    auVar107 = vperm2f128_avx(auVar71,auVar71,1);
    auVar107 = vshufps_avx(auVar107,auVar71,0x30);
    auVar16 = vshufps_avx(auVar71,auVar107,0x29);
    local_580 = vsubps_avx(auVar16,auVar71);
    auVar19._4_4_ = fVar293 * fVar315;
    auVar19._0_4_ = fVar213 * fVar305;
    auVar19._8_4_ = fVar221 * fVar316;
    auVar19._12_4_ = fVar251 * fVar318;
    auVar19._16_4_ = fVar279 * fVar320;
    auVar19._20_4_ = fVar359 * fVar322;
    auVar19._24_4_ = fVar11 * fVar324;
    auVar19._28_4_ = auVar107._28_4_;
    fVar270 = local_580._0_4_;
    fVar296 = local_580._4_4_;
    auVar20._4_4_ = fVar378 * fVar296;
    auVar20._0_4_ = fVar370 * fVar270;
    fVar239 = local_580._8_4_;
    auVar20._8_4_ = fVar381 * fVar239;
    fVar269 = local_580._12_4_;
    auVar20._12_4_ = fVar383 * fVar269;
    fVar291 = local_580._16_4_;
    auVar20._16_4_ = fVar385 * fVar291;
    fVar391 = local_580._20_4_;
    auVar20._20_4_ = fVar387 * fVar391;
    fVar12 = local_580._24_4_;
    auVar20._24_4_ = fVar389 * fVar12;
    auVar20._28_4_ = fVar133;
    auVar18 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar363 * fVar296;
    auVar21._0_4_ = fVar360 * fVar270;
    auVar21._8_4_ = fVar364 * fVar239;
    auVar21._12_4_ = fVar365 * fVar269;
    auVar21._16_4_ = fVar366 * fVar291;
    auVar21._20_4_ = fVar367 * fVar391;
    auVar21._24_4_ = fVar368 * fVar12;
    auVar21._28_4_ = fVar133;
    auVar22._4_4_ = fVar290 * fVar315;
    auVar22._0_4_ = fVar268 * fVar305;
    auVar22._8_4_ = fVar220 * fVar316;
    auVar22._12_4_ = fVar248 * fVar318;
    auVar22._16_4_ = fVar276 * fVar320;
    auVar22._20_4_ = fVar303 * fVar322;
    auVar22._24_4_ = fVar10 * fVar324;
    auVar22._28_4_ = auVar346._28_4_;
    auVar19 = vsubps_avx(auVar22,auVar21);
    fVar194 = auVar19._28_4_;
    fVar275 = auVar18._28_4_ + fVar194;
    auVar207._0_4_ = fVar270 * fVar270 + fVar268 * fVar268 + fVar213 * fVar213;
    auVar207._4_4_ = fVar296 * fVar296 + fVar290 * fVar290 + fVar293 * fVar293;
    auVar207._8_4_ = fVar239 * fVar239 + fVar220 * fVar220 + fVar221 * fVar221;
    auVar207._12_4_ = fVar269 * fVar269 + fVar248 * fVar248 + fVar251 * fVar251;
    auVar207._16_4_ = fVar291 * fVar291 + fVar276 * fVar276 + fVar279 * fVar279;
    auVar207._20_4_ = fVar391 * fVar391 + fVar303 * fVar303 + fVar359 * fVar359;
    auVar207._24_4_ = fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11;
    auVar207._28_4_ = fVar194 + fVar194 + fVar275;
    auVar107 = vrcpps_avx(auVar207);
    fVar299 = auVar107._0_4_;
    fVar301 = auVar107._4_4_;
    auVar342._4_4_ = fVar301 * auVar207._4_4_;
    auVar342._0_4_ = fVar299 * auVar207._0_4_;
    fVar241 = auVar107._8_4_;
    auVar342._8_4_ = fVar241 * auVar207._8_4_;
    fVar243 = auVar107._12_4_;
    auVar342._12_4_ = fVar243 * auVar207._12_4_;
    fVar245 = auVar107._16_4_;
    auVar342._16_4_ = fVar245 * auVar207._16_4_;
    fVar247 = auVar107._20_4_;
    auVar342._20_4_ = fVar247 * auVar207._20_4_;
    fVar249 = auVar107._24_4_;
    auVar342._24_4_ = fVar249 * auVar207._24_4_;
    auVar342._28_4_ = auVar346._28_4_;
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = &DAT_3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar109._16_4_ = 0x3f800000;
    auVar109._20_4_ = 0x3f800000;
    auVar109._24_4_ = 0x3f800000;
    auVar109._28_4_ = 0x3f800000;
    auVar20 = vsubps_avx(auVar109,auVar342);
    fVar299 = auVar20._0_4_ * fVar299 + fVar299;
    fVar301 = auVar20._4_4_ * fVar301 + fVar301;
    fVar241 = auVar20._8_4_ * fVar241 + fVar241;
    fVar243 = auVar20._12_4_ * fVar243 + fVar243;
    fVar245 = auVar20._16_4_ * fVar245 + fVar245;
    fVar247 = auVar20._20_4_ * fVar247 + fVar247;
    fVar249 = auVar20._24_4_ * fVar249 + fVar249;
    auVar108 = vperm2f128_avx(local_b00,local_b00,1);
    auVar108 = vshufps_avx(auVar108,local_b00,0x30);
    local_940 = vshufps_avx(local_b00,auVar108,0x29);
    auVar108 = vperm2f128_avx(auVar23,auVar23,1);
    auVar108 = vshufps_avx(auVar108,auVar23,0x30);
    local_980 = vshufps_avx(auVar23,auVar108,0x29);
    fVar371 = local_980._0_4_;
    fVar379 = local_980._4_4_;
    auVar24._4_4_ = fVar379 * fVar290;
    auVar24._0_4_ = fVar371 * fVar268;
    fVar382 = local_980._8_4_;
    auVar24._8_4_ = fVar382 * fVar220;
    fVar384 = local_980._12_4_;
    auVar24._12_4_ = fVar384 * fVar248;
    fVar386 = local_980._16_4_;
    auVar24._16_4_ = fVar386 * fVar276;
    fVar388 = local_980._20_4_;
    auVar24._20_4_ = fVar388 * fVar303;
    fVar390 = local_980._24_4_;
    auVar24._24_4_ = fVar390 * fVar10;
    auVar24._28_4_ = auVar108._28_4_;
    fVar214 = local_940._0_4_;
    fVar216 = local_940._4_4_;
    auVar25._4_4_ = fVar293 * fVar216;
    auVar25._0_4_ = fVar213 * fVar214;
    fVar240 = local_940._8_4_;
    auVar25._8_4_ = fVar221 * fVar240;
    fVar271 = local_940._12_4_;
    auVar25._12_4_ = fVar251 * fVar271;
    fVar294 = local_940._16_4_;
    auVar25._16_4_ = fVar279 * fVar294;
    fVar277 = local_940._20_4_;
    auVar25._20_4_ = fVar359 * fVar277;
    fVar13 = local_940._24_4_;
    auVar25._24_4_ = fVar11 * fVar13;
    auVar25._28_4_ = fVar369;
    auVar21 = vsubps_avx(auVar25,auVar24);
    auVar108 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar108 = vshufps_avx(auVar108,_local_ae0,0x30);
    local_960 = vshufps_avx(_local_ae0,auVar108,0x29);
    fVar272 = local_960._0_4_;
    fVar217 = local_960._4_4_;
    auVar26._4_4_ = fVar293 * fVar217;
    auVar26._0_4_ = fVar213 * fVar272;
    fVar242 = local_960._8_4_;
    auVar26._8_4_ = fVar221 * fVar242;
    fVar273 = local_960._12_4_;
    auVar26._12_4_ = fVar251 * fVar273;
    fVar297 = local_960._16_4_;
    auVar26._16_4_ = fVar279 * fVar297;
    fVar369 = local_960._20_4_;
    auVar26._20_4_ = fVar359 * fVar369;
    fVar14 = local_960._24_4_;
    auVar26._24_4_ = fVar11 * fVar14;
    auVar26._28_4_ = auVar108._28_4_;
    auVar27._4_4_ = fVar379 * fVar296;
    auVar27._0_4_ = fVar371 * fVar270;
    auVar27._8_4_ = fVar382 * fVar239;
    auVar27._12_4_ = fVar384 * fVar269;
    auVar27._16_4_ = fVar386 * fVar291;
    auVar27._20_4_ = fVar388 * fVar391;
    uVar8 = local_980._28_4_;
    auVar27._24_4_ = fVar390 * fVar12;
    auVar27._28_4_ = uVar8;
    auVar22 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar296 * fVar216;
    auVar28._0_4_ = fVar270 * fVar214;
    auVar28._8_4_ = fVar239 * fVar240;
    auVar28._12_4_ = fVar269 * fVar271;
    auVar28._16_4_ = fVar291 * fVar294;
    auVar28._20_4_ = fVar391 * fVar277;
    auVar28._24_4_ = fVar12 * fVar13;
    auVar28._28_4_ = uVar8;
    auVar29._4_4_ = fVar290 * fVar217;
    auVar29._0_4_ = fVar268 * fVar272;
    auVar29._8_4_ = fVar220 * fVar242;
    auVar29._12_4_ = fVar248 * fVar273;
    auVar29._16_4_ = fVar276 * fVar297;
    auVar29._20_4_ = fVar303 * fVar369;
    auVar29._24_4_ = fVar10 * fVar14;
    auVar29._28_4_ = auVar392._28_4_;
    auVar108 = vsubps_avx(auVar29,auVar28);
    fVar194 = auVar108._28_4_;
    auVar30._4_4_ =
         (auVar377._4_4_ * auVar377._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar19._4_4_ * auVar19._4_4_) * fVar301;
    auVar30._0_4_ =
         (auVar377._0_4_ * auVar377._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar19._0_4_ * auVar19._0_4_) * fVar299;
    auVar30._8_4_ =
         (auVar377._8_4_ * auVar377._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar19._8_4_ * auVar19._8_4_) * fVar241;
    auVar30._12_4_ =
         (auVar377._12_4_ * auVar377._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar19._12_4_ * auVar19._12_4_) * fVar243;
    auVar30._16_4_ =
         (auVar377._16_4_ * auVar377._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar19._16_4_ * auVar19._16_4_) * fVar245;
    auVar30._20_4_ =
         (auVar377._20_4_ * auVar377._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar19._20_4_ * auVar19._20_4_) * fVar247;
    auVar30._24_4_ =
         (auVar377._24_4_ * auVar377._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar19._24_4_ * auVar19._24_4_) * fVar249;
    auVar30._28_4_ = auVar377._28_4_ + fVar275;
    auVar31._4_4_ =
         (auVar21._4_4_ * auVar21._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar108._4_4_ * auVar108._4_4_) * fVar301;
    auVar31._0_4_ =
         (auVar21._0_4_ * auVar21._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar108._0_4_ * auVar108._0_4_) * fVar299;
    auVar31._8_4_ =
         (auVar21._8_4_ * auVar21._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar108._8_4_ * auVar108._8_4_) * fVar241;
    auVar31._12_4_ =
         (auVar21._12_4_ * auVar21._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar108._12_4_ * auVar108._12_4_) * fVar243;
    auVar31._16_4_ =
         (auVar21._16_4_ * auVar21._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar108._16_4_ * auVar108._16_4_) * fVar245;
    auVar31._20_4_ =
         (auVar21._20_4_ * auVar21._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar108._20_4_ * auVar108._20_4_) * fVar247;
    auVar31._24_4_ =
         (auVar21._24_4_ * auVar21._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar108._24_4_ * auVar108._24_4_) * fVar249;
    auVar31._28_4_ = auVar20._28_4_ + auVar107._28_4_;
    auVar107 = vmaxps_avx(auVar30,auVar31);
    auVar108 = vperm2f128_avx(local_760,local_760,1);
    auVar108 = vshufps_avx(auVar108,local_760,0x30);
    local_7a0 = vshufps_avx(local_760,auVar108,0x29);
    local_620._0_4_ = (float)local_760._0_4_ + fVar215;
    local_620._4_4_ = local_760._4_4_ + fVar278;
    local_620._8_4_ = local_760._8_4_ + fVar218;
    local_620._12_4_ = local_760._12_4_ + fVar219;
    local_620._16_4_ = local_760._16_4_ + fVar244;
    local_620._20_4_ = local_760._20_4_ + fVar246;
    local_620._24_4_ = local_760._24_4_ + fVar274;
    local_620._28_4_ = local_760._28_4_ + auVar17._28_4_;
    auVar108 = vmaxps_avx(local_760,local_620);
    auVar17 = vmaxps_avx(local_780,local_7a0);
    auVar108 = vmaxps_avx(auVar108,auVar17);
    auVar17 = vrsqrtps_avx(auVar207);
    fVar215 = auVar17._0_4_;
    fVar278 = auVar17._4_4_;
    fVar218 = auVar17._8_4_;
    fVar219 = auVar17._12_4_;
    fVar244 = auVar17._16_4_;
    fVar246 = auVar17._20_4_;
    fVar274 = auVar17._24_4_;
    local_400 = fVar215 * 1.5 + fVar215 * fVar215 * fVar215 * auVar207._0_4_ * -0.5;
    fStack_3fc = fVar278 * 1.5 + fVar278 * fVar278 * fVar278 * auVar207._4_4_ * -0.5;
    fStack_3f8 = fVar218 * 1.5 + fVar218 * fVar218 * fVar218 * auVar207._8_4_ * -0.5;
    fStack_3f4 = fVar219 * 1.5 + fVar219 * fVar219 * fVar219 * auVar207._12_4_ * -0.5;
    fStack_3f0 = fVar244 * 1.5 + fVar244 * fVar244 * fVar244 * auVar207._16_4_ * -0.5;
    fStack_3ec = fVar246 * 1.5 + fVar246 * fVar246 * fVar246 * auVar207._20_4_ * -0.5;
    fStack_3e8 = fVar274 * 1.5 + fVar274 * fVar274 * fVar274 * auVar207._24_4_ * -0.5;
    fStack_3e4 = auVar17._28_4_ + auVar207._28_4_;
    auVar74._4_4_ = fVar120;
    auVar74._0_4_ = fVar91;
    auVar74._8_4_ = fVar123;
    auVar74._12_4_ = fVar126;
    auVar74._16_4_ = fVar128;
    auVar74._20_4_ = fVar130;
    auVar74._24_4_ = fVar132;
    auVar74._28_4_ = fVar134;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar74);
    auVar377 = vsubps_avx(ZEXT832(0) << 0x20,_local_640);
    fVar396 = auVar377._0_4_;
    fVar398 = auVar377._4_4_;
    fVar399 = auVar377._8_4_;
    fVar400 = auVar377._12_4_;
    fVar401 = auVar377._16_4_;
    fVar402 = auVar377._20_4_;
    fVar403 = auVar377._24_4_;
    fVar215 = local_9a0._0_4_;
    fVar218 = local_9a0._4_4_;
    fVar244 = local_9a0._8_4_;
    fVar274 = local_9a0._12_4_;
    fVar299 = local_9a0._16_4_;
    fVar241 = local_9a0._20_4_;
    fVar245 = local_9a0._24_4_;
    auVar72._4_4_ = fVar119;
    auVar72._0_4_ = fVar90;
    auVar72._8_4_ = fVar122;
    auVar72._12_4_ = fVar125;
    auVar72._16_4_ = fVar127;
    auVar72._20_4_ = fVar129;
    auVar72._24_4_ = fVar131;
    auVar72._28_4_ = fVar133;
    auVar377 = vsubps_avx(ZEXT832(0) << 0x20,auVar72);
    fVar278 = auVar377._0_4_;
    fVar219 = auVar377._4_4_;
    fVar246 = auVar377._8_4_;
    fVar275 = auVar377._12_4_;
    fVar301 = auVar377._16_4_;
    fVar243 = auVar377._20_4_;
    fVar247 = auVar377._24_4_;
    auVar362._0_4_ =
         (float)local_7c0._0_4_ * fVar278 +
         (float)local_7e0._0_4_ * fVar215 + fVar396 * (float)local_800._0_4_;
    auVar362._4_4_ =
         (float)local_7c0._4_4_ * fVar219 +
         (float)local_7e0._4_4_ * fVar218 + fVar398 * (float)local_800._4_4_;
    auVar362._8_4_ = fStack_7b8 * fVar246 + fStack_7d8 * fVar244 + fVar399 * fStack_7f8;
    auVar362._12_4_ = fStack_7b4 * fVar275 + fStack_7d4 * fVar274 + fVar400 * fStack_7f4;
    auVar362._16_4_ = fStack_7b0 * fVar301 + fStack_7d0 * fVar299 + fVar401 * fStack_7f0;
    auVar362._20_4_ = fStack_7ac * fVar243 + fStack_7cc * fVar241 + fVar402 * fStack_7ec;
    auVar362._24_4_ = fStack_7a8 * fVar247 + fStack_7c8 * fVar245 + fVar403 * fStack_7e8;
    auVar362._28_4_ = fVar194 + auVar22._28_4_ + fVar194 + auVar17._28_4_;
    auVar374._0_4_ = fVar278 * fVar278 + fVar215 * fVar215 + fVar396 * fVar396;
    auVar374._4_4_ = fVar219 * fVar219 + fVar218 * fVar218 + fVar398 * fVar398;
    auVar374._8_4_ = fVar246 * fVar246 + fVar244 * fVar244 + fVar399 * fVar399;
    auVar374._12_4_ = fVar275 * fVar275 + fVar274 * fVar274 + fVar400 * fVar400;
    auVar374._16_4_ = fVar301 * fVar301 + fVar299 * fVar299 + fVar401 * fVar401;
    auVar374._20_4_ = fVar243 * fVar243 + fVar241 * fVar241 + fVar402 * fVar402;
    auVar374._24_4_ = fVar247 * fVar247 + fVar245 * fVar245 + fVar403 * fVar403;
    auVar374._28_4_ = auVar392._28_4_ + auVar392._28_4_ + fVar194;
    fVar326 = (float)local_7c0._0_4_ * fVar270 * local_400 +
              fVar268 * local_400 * (float)local_7e0._0_4_ +
              fVar213 * local_400 * (float)local_800._0_4_;
    fVar330 = (float)local_7c0._4_4_ * fVar296 * fStack_3fc +
              fVar290 * fStack_3fc * (float)local_7e0._4_4_ +
              fVar293 * fStack_3fc * (float)local_800._4_4_;
    fVar331 = fStack_7b8 * fVar239 * fStack_3f8 +
              fVar220 * fStack_3f8 * fStack_7d8 + fVar221 * fStack_3f8 * fStack_7f8;
    fVar332 = fStack_7b4 * fVar269 * fStack_3f4 +
              fVar248 * fStack_3f4 * fStack_7d4 + fVar251 * fStack_3f4 * fStack_7f4;
    fVar333 = fStack_7b0 * fVar291 * fStack_3f0 +
              fVar276 * fStack_3f0 * fStack_7d0 + fVar279 * fStack_3f0 * fStack_7f0;
    fVar334 = fStack_7ac * fVar391 * fStack_3ec +
              fVar303 * fStack_3ec * fStack_7cc + fVar359 * fStack_3ec * fStack_7ec;
    fVar335 = fStack_7a8 * fVar12 * fStack_3e8 +
              fVar10 * fStack_3e8 * fStack_7c8 + fVar11 * fStack_3e8 * fStack_7e8;
    fVar194 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    fVar344 = fVar278 * fVar270 * local_400 +
              fVar268 * local_400 * fVar215 + fVar396 * fVar213 * local_400;
    fVar348 = fVar219 * fVar296 * fStack_3fc +
              fVar290 * fStack_3fc * fVar218 + fVar398 * fVar293 * fStack_3fc;
    fVar349 = fVar246 * fVar239 * fStack_3f8 +
              fVar220 * fStack_3f8 * fVar244 + fVar399 * fVar221 * fStack_3f8;
    fVar350 = fVar275 * fVar269 * fStack_3f4 +
              fVar248 * fStack_3f4 * fVar274 + fVar400 * fVar251 * fStack_3f4;
    fVar351 = fVar301 * fVar291 * fStack_3f0 +
              fVar276 * fStack_3f0 * fVar299 + fVar401 * fVar279 * fStack_3f0;
    fVar352 = fVar243 * fVar391 * fStack_3ec +
              fVar303 * fStack_3ec * fVar241 + fVar402 * fVar359 * fStack_3ec;
    fVar353 = fVar247 * fVar12 * fStack_3e8 +
              fVar10 * fStack_3e8 * fVar245 + fVar403 * fVar11 * fStack_3e8;
    fVar354 = fStack_7c4 + fVar194;
    auVar17._4_4_ = fVar330 * fVar348;
    auVar17._0_4_ = fVar326 * fVar344;
    auVar17._8_4_ = fVar331 * fVar349;
    auVar17._12_4_ = fVar332 * fVar350;
    auVar17._16_4_ = fVar333 * fVar351;
    auVar17._20_4_ = fVar334 * fVar352;
    auVar17._24_4_ = fVar335 * fVar353;
    auVar17._28_4_ = fVar194;
    auVar18 = vsubps_avx(auVar362,auVar17);
    auVar32._4_4_ = fVar348 * fVar348;
    auVar32._0_4_ = fVar344 * fVar344;
    auVar32._8_4_ = fVar349 * fVar349;
    auVar32._12_4_ = fVar350 * fVar350;
    auVar32._16_4_ = fVar351 * fVar351;
    auVar32._20_4_ = fVar352 * fVar352;
    auVar32._24_4_ = fVar353 * fVar353;
    auVar32._28_4_ = fStack_7c4;
    auVar19 = vsubps_avx(auVar374,auVar32);
    auVar17 = vsqrtps_avx(auVar107);
    fVar194 = (auVar17._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar249 = (auVar17._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar170 = (auVar17._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar172 = (auVar17._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar173 = (auVar17._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar174 = (auVar17._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar175 = (auVar17._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar249 * fVar249;
    auVar33._0_4_ = fVar194 * fVar194;
    auVar33._8_4_ = fVar170 * fVar170;
    auVar33._12_4_ = fVar172 * fVar172;
    auVar33._16_4_ = fVar173 * fVar173;
    auVar33._20_4_ = fVar174 * fVar174;
    auVar33._24_4_ = fVar175 * fVar175;
    auVar33._28_4_ = auVar17._28_4_ + auVar108._28_4_;
    fVar372 = auVar18._0_4_ + auVar18._0_4_;
    fVar380 = auVar18._4_4_ + auVar18._4_4_;
    local_5a0._0_8_ = CONCAT44(fVar380,fVar372);
    local_5a0._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    local_5a0._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    local_5a0._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    local_5a0._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    local_5a0._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    fVar194 = auVar18._28_4_;
    local_5a0._28_4_ = fVar194 + fVar194;
    auVar108 = vsubps_avx(auVar19,auVar33);
    local_420._4_4_ = fVar330 * fVar330;
    local_420._0_4_ = fVar326 * fVar326;
    local_420._8_4_ = fVar331 * fVar331;
    local_420._12_4_ = fVar332 * fVar332;
    local_420._16_4_ = fVar333 * fVar333;
    local_420._20_4_ = fVar334 * fVar334;
    local_420._24_4_ = fVar335 * fVar335;
    local_420._28_4_ = local_580._28_4_;
    auVar358 = ZEXT3264(local_420);
    local_660 = vsubps_avx(local_3a0,local_420);
    auVar34._4_4_ = fVar380 * fVar380;
    auVar34._0_4_ = fVar372 * fVar372;
    auVar34._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar34._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar34._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar34._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar34._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar34._28_4_ = fVar194;
    fVar249 = local_660._0_4_;
    fVar170 = local_660._4_4_;
    fVar172 = local_660._8_4_;
    fVar173 = local_660._12_4_;
    fVar174 = local_660._16_4_;
    fVar175 = local_660._20_4_;
    fVar343 = local_660._24_4_;
    auVar35._4_4_ = fVar170 * 4.0 * auVar108._4_4_;
    auVar35._0_4_ = fVar249 * 4.0 * auVar108._0_4_;
    auVar35._8_4_ = fVar172 * 4.0 * auVar108._8_4_;
    auVar35._12_4_ = fVar173 * 4.0 * auVar108._12_4_;
    auVar35._16_4_ = fVar174 * 4.0 * auVar108._16_4_;
    auVar35._20_4_ = fVar175 * 4.0 * auVar108._20_4_;
    auVar35._24_4_ = fVar343 * 4.0 * auVar108._24_4_;
    auVar35._28_4_ = 0x40800000;
    auVar18 = vsubps_avx(auVar34,auVar35);
    auVar107 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
    fVar194 = local_660._28_4_;
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0x7f,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0xbf,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f])
    {
      auVar208._8_4_ = 0x7f800000;
      auVar208._0_8_ = 0x7f8000007f800000;
      auVar208._12_4_ = 0x7f800000;
      auVar208._16_4_ = 0x7f800000;
      auVar208._20_4_ = 0x7f800000;
      auVar208._24_4_ = 0x7f800000;
      auVar208._28_4_ = 0x7f800000;
      auVar393._8_4_ = 0xff800000;
      auVar393._0_8_ = 0xff800000ff800000;
      auVar393._12_4_ = 0xff800000;
      auVar393._16_4_ = 0xff800000;
      auVar393._20_4_ = 0xff800000;
      auVar393._24_4_ = 0xff800000;
      auVar393._28_4_ = 0xff800000;
    }
    else {
      auVar22 = vsqrtps_avx(auVar18);
      auVar284._0_4_ = fVar249 + fVar249;
      auVar284._4_4_ = fVar170 + fVar170;
      auVar284._8_4_ = fVar172 + fVar172;
      auVar284._12_4_ = fVar173 + fVar173;
      auVar284._16_4_ = fVar174 + fVar174;
      auVar284._20_4_ = fVar175 + fVar175;
      auVar284._24_4_ = fVar343 + fVar343;
      auVar284._28_4_ = fVar194 + fVar194;
      auVar21 = vrcpps_avx(auVar284);
      auVar20 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
      fVar280 = auVar21._0_4_;
      fVar292 = auVar21._4_4_;
      auVar36._4_4_ = auVar284._4_4_ * fVar292;
      auVar36._0_4_ = auVar284._0_4_ * fVar280;
      fVar295 = auVar21._8_4_;
      auVar36._8_4_ = auVar284._8_4_ * fVar295;
      fVar298 = auVar21._12_4_;
      auVar36._12_4_ = auVar284._12_4_ * fVar298;
      fVar300 = auVar21._16_4_;
      auVar36._16_4_ = auVar284._16_4_ * fVar300;
      fVar302 = auVar21._20_4_;
      auVar36._20_4_ = auVar284._20_4_ * fVar302;
      fVar304 = auVar21._24_4_;
      auVar36._24_4_ = auVar284._24_4_ * fVar304;
      auVar36._28_4_ = auVar284._28_4_;
      auVar209._8_4_ = 0x3f800000;
      auVar209._0_8_ = &DAT_3f8000003f800000;
      auVar209._12_4_ = 0x3f800000;
      auVar209._16_4_ = 0x3f800000;
      auVar209._20_4_ = 0x3f800000;
      auVar209._24_4_ = 0x3f800000;
      auVar209._28_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar209,auVar36);
      fVar280 = fVar280 + fVar280 * auVar18._0_4_;
      fVar292 = fVar292 + fVar292 * auVar18._4_4_;
      fVar295 = fVar295 + fVar295 * auVar18._8_4_;
      fVar298 = fVar298 + fVar298 * auVar18._12_4_;
      fVar300 = fVar300 + fVar300 * auVar18._16_4_;
      fVar302 = fVar302 + fVar302 * auVar18._20_4_;
      fVar304 = fVar304 + fVar304 * auVar18._24_4_;
      auVar310._0_8_ = CONCAT44(fVar380,fVar372) ^ 0x8000000080000000;
      auVar310._8_4_ = -local_5a0._8_4_;
      auVar310._12_4_ = -local_5a0._12_4_;
      auVar310._16_4_ = -local_5a0._16_4_;
      auVar310._20_4_ = -local_5a0._20_4_;
      auVar310._24_4_ = -local_5a0._24_4_;
      auVar310._28_4_ = -local_5a0._28_4_;
      auVar342 = vsubps_avx(auVar310,auVar22);
      fVar372 = auVar342._0_4_ * fVar280;
      fVar380 = auVar342._4_4_ * fVar292;
      auVar37._4_4_ = fVar380;
      auVar37._0_4_ = fVar372;
      fVar317 = auVar342._8_4_ * fVar295;
      auVar37._8_4_ = fVar317;
      fVar319 = auVar342._12_4_ * fVar298;
      auVar37._12_4_ = fVar319;
      fVar321 = auVar342._16_4_ * fVar300;
      auVar37._16_4_ = fVar321;
      fVar323 = auVar342._20_4_ * fVar302;
      auVar37._20_4_ = fVar323;
      fVar325 = auVar342._24_4_ * fVar304;
      auVar37._24_4_ = fVar325;
      auVar37._28_4_ = auVar342._28_4_;
      auVar22 = vsubps_avx(auVar22,local_5a0);
      fVar280 = auVar22._0_4_ * fVar280;
      fVar292 = auVar22._4_4_ * fVar292;
      auVar38._4_4_ = fVar292;
      auVar38._0_4_ = fVar280;
      fVar295 = auVar22._8_4_ * fVar295;
      auVar38._8_4_ = fVar295;
      fVar298 = auVar22._12_4_ * fVar298;
      auVar38._12_4_ = fVar298;
      fVar300 = auVar22._16_4_ * fVar300;
      auVar38._16_4_ = fVar300;
      fVar302 = auVar22._20_4_ * fVar302;
      auVar38._20_4_ = fVar302;
      fVar304 = auVar22._24_4_ * fVar304;
      auVar38._24_4_ = fVar304;
      auVar38._28_4_ = auVar22._28_4_;
      fStack_4e4 = fVar354 + auVar21._28_4_ + auVar18._28_4_;
      local_500[0] = local_400 * (fVar344 + fVar326 * fVar372);
      local_500[1] = fStack_3fc * (fVar348 + fVar330 * fVar380);
      local_500[2] = fStack_3f8 * (fVar349 + fVar331 * fVar317);
      local_500[3] = fStack_3f4 * (fVar350 + fVar332 * fVar319);
      fStack_4f0 = fStack_3f0 * (fVar351 + fVar333 * fVar321);
      fStack_4ec = fStack_3ec * (fVar352 + fVar334 * fVar323);
      fStack_4e8 = fStack_3e8 * (fVar353 + fVar335 * fVar325);
      local_520[0] = local_400 * (fVar344 + fVar326 * fVar280);
      local_520[1] = fStack_3fc * (fVar348 + fVar330 * fVar292);
      local_520[2] = fStack_3f8 * (fVar349 + fVar331 * fVar295);
      local_520[3] = fStack_3f4 * (fVar350 + fVar332 * fVar298);
      fStack_510 = fStack_3f0 * (fVar351 + fVar333 * fVar300);
      fStack_50c = fStack_3ec * (fVar352 + fVar334 * fVar302);
      fStack_508 = fStack_3e8 * (fVar353 + fVar335 * fVar304);
      fStack_504 = fVar354 + fStack_4e4;
      auVar285._8_4_ = 0x7f800000;
      auVar285._0_8_ = 0x7f8000007f800000;
      auVar285._12_4_ = 0x7f800000;
      auVar285._16_4_ = 0x7f800000;
      auVar285._20_4_ = 0x7f800000;
      auVar285._24_4_ = 0x7f800000;
      auVar285._28_4_ = 0x7f800000;
      auVar208 = vblendvps_avx(auVar285,auVar37,auVar20);
      auVar311._8_4_ = 0x7fffffff;
      auVar311._0_8_ = 0x7fffffff7fffffff;
      auVar311._12_4_ = 0x7fffffff;
      auVar311._16_4_ = 0x7fffffff;
      auVar311._20_4_ = 0x7fffffff;
      auVar311._24_4_ = 0x7fffffff;
      auVar311._28_4_ = 0x7fffffff;
      auVar18 = vandps_avx(local_420,auVar311);
      auVar18 = vmaxps_avx(local_4c0,auVar18);
      auVar39._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar18._28_4_;
      auVar18 = vandps_avx(local_660,auVar311);
      auVar18 = vcmpps_avx(auVar18,auVar39,1);
      auVar286._8_4_ = 0xff800000;
      auVar286._0_8_ = 0xff800000ff800000;
      auVar286._12_4_ = 0xff800000;
      auVar286._16_4_ = 0xff800000;
      auVar286._20_4_ = 0xff800000;
      auVar286._24_4_ = 0xff800000;
      auVar286._28_4_ = 0xff800000;
      auVar393 = vblendvps_avx(auVar286,auVar38,auVar20);
      auVar21 = auVar20 & auVar18;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar107 = vandps_avx(auVar18,auVar20);
        auVar138 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar18 = vcmpps_avx(auVar108,ZEXT832(0) << 0x20,2);
        auVar329._8_4_ = 0xff800000;
        auVar329._0_8_ = 0xff800000ff800000;
        auVar329._12_4_ = 0xff800000;
        auVar329._16_4_ = 0xff800000;
        auVar329._20_4_ = 0xff800000;
        auVar329._24_4_ = 0xff800000;
        auVar329._28_4_ = 0xff800000;
        auVar376._8_4_ = 0x7f800000;
        auVar376._0_8_ = 0x7f8000007f800000;
        auVar376._12_4_ = 0x7f800000;
        auVar376._16_4_ = 0x7f800000;
        auVar376._20_4_ = 0x7f800000;
        auVar376._24_4_ = 0x7f800000;
        auVar376._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar376,auVar329,auVar18);
        auVar142 = vpmovsxwd_avx(auVar138);
        auVar138 = vpunpckhwd_avx(auVar138,auVar138);
        auVar267._16_16_ = auVar138;
        auVar267._0_16_ = auVar142;
        auVar208 = vblendvps_avx(auVar208,auVar108,auVar267);
        auVar108 = vblendvps_avx(auVar329,auVar376,auVar18);
        auVar393 = vblendvps_avx(auVar393,auVar108,auVar267);
        auVar108 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar192._0_4_ = auVar107._0_4_ ^ auVar108._0_4_;
        auVar192._4_4_ = auVar107._4_4_ ^ auVar108._4_4_;
        auVar192._8_4_ = auVar107._8_4_ ^ auVar108._8_4_;
        auVar192._12_4_ = auVar107._12_4_ ^ auVar108._12_4_;
        auVar192._16_4_ = auVar107._16_4_ ^ auVar108._16_4_;
        auVar192._20_4_ = auVar107._20_4_ ^ auVar108._20_4_;
        auVar192._24_4_ = auVar107._24_4_ ^ auVar108._24_4_;
        auVar192._28_4_ = auVar107._28_4_ ^ auVar108._28_4_;
        auVar107 = vorps_avx(auVar18,auVar192);
        auVar107 = vandps_avx(auVar20,auVar107);
      }
    }
    auVar108 = local_3c0 & auVar107;
    auVar289 = ZEXT3264(_local_900);
    auVar314 = ZEXT1664(local_a00);
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar138 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar153._16_16_ = auVar138;
      auVar153._0_16_ = auVar138;
      local_5c0 = vminps_avx(auVar153,auVar393);
      auVar110._0_4_ =
           (float)local_7c0._0_4_ * fVar305 +
           (float)local_7e0._0_4_ * fVar360 + fVar370 * (float)local_800._0_4_;
      auVar110._4_4_ =
           (float)local_7c0._4_4_ * fVar315 +
           (float)local_7e0._4_4_ * fVar363 + fVar378 * (float)local_800._4_4_;
      auVar110._8_4_ = fStack_7b8 * fVar316 + fStack_7d8 * fVar364 + fVar381 * fStack_7f8;
      auVar110._12_4_ = fStack_7b4 * fVar318 + fStack_7d4 * fVar365 + fVar383 * fStack_7f4;
      auVar110._16_4_ = fStack_7b0 * fVar320 + fStack_7d0 * fVar366 + fVar385 * fStack_7f0;
      auVar110._20_4_ = fStack_7ac * fVar322 + fStack_7cc * fVar367 + fVar387 * fStack_7ec;
      auVar110._24_4_ = fStack_7a8 * fVar324 + fStack_7c8 * fVar368 + fVar389 * fStack_7e8;
      auVar110._28_4_ = auVar309._28_4_ + auVar377._28_4_ + 1.0;
      auVar108 = vrcpps_avx(auVar110);
      fVar372 = auVar108._0_4_;
      fVar380 = auVar108._4_4_;
      auVar40._4_4_ = auVar110._4_4_ * fVar380;
      auVar40._0_4_ = auVar110._0_4_ * fVar372;
      fVar280 = auVar108._8_4_;
      auVar40._8_4_ = auVar110._8_4_ * fVar280;
      fVar292 = auVar108._12_4_;
      auVar40._12_4_ = auVar110._12_4_ * fVar292;
      fVar295 = auVar108._16_4_;
      auVar40._16_4_ = auVar110._16_4_ * fVar295;
      fVar298 = auVar108._20_4_;
      auVar40._20_4_ = auVar110._20_4_ * fVar298;
      fVar300 = auVar108._24_4_;
      auVar40._24_4_ = auVar110._24_4_ * fVar300;
      auVar40._28_4_ = 0x3f800000;
      auVar375._8_4_ = 0x3f800000;
      auVar375._0_8_ = &DAT_3f8000003f800000;
      auVar375._12_4_ = 0x3f800000;
      auVar375._16_4_ = 0x3f800000;
      auVar375._20_4_ = 0x3f800000;
      auVar375._24_4_ = 0x3f800000;
      auVar375._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar375,auVar40);
      auVar341._8_4_ = 0x7fffffff;
      auVar341._0_8_ = 0x7fffffff7fffffff;
      auVar341._12_4_ = 0x7fffffff;
      auVar341._16_4_ = 0x7fffffff;
      auVar341._20_4_ = 0x7fffffff;
      auVar341._24_4_ = 0x7fffffff;
      auVar341._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar341,auVar110);
      auVar394._8_4_ = 0x219392ef;
      auVar394._0_8_ = 0x219392ef219392ef;
      auVar394._12_4_ = 0x219392ef;
      auVar394._16_4_ = 0x219392ef;
      auVar394._20_4_ = 0x219392ef;
      auVar394._24_4_ = 0x219392ef;
      auVar394._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar108,auVar394,1);
      auVar41._4_4_ =
           (fVar380 + fVar380 * auVar20._4_4_) *
           -(fVar219 * fVar315 + fVar363 * fVar218 + fVar398 * fVar378);
      auVar41._0_4_ =
           (fVar372 + fVar372 * auVar20._0_4_) *
           -(fVar278 * fVar305 + fVar360 * fVar215 + fVar396 * fVar370);
      auVar41._8_4_ =
           (fVar280 + fVar280 * auVar20._8_4_) *
           -(fVar246 * fVar316 + fVar364 * fVar244 + fVar399 * fVar381);
      auVar41._12_4_ =
           (fVar292 + fVar292 * auVar20._12_4_) *
           -(fVar275 * fVar318 + fVar365 * fVar274 + fVar400 * fVar383);
      auVar41._16_4_ =
           (fVar295 + fVar295 * auVar20._16_4_) *
           -(fVar301 * fVar320 + fVar366 * fVar299 + fVar401 * fVar385);
      auVar41._20_4_ =
           (fVar298 + fVar298 * auVar20._20_4_) *
           -(fVar243 * fVar322 + fVar367 * fVar241 + fVar402 * fVar387);
      auVar41._24_4_ =
           (fVar300 + fVar300 * auVar20._24_4_) *
           -(fVar247 * fVar324 + fVar368 * fVar245 + fVar403 * fVar389);
      auVar41._28_4_ = -(auVar377._28_4_ + auVar208._28_4_ + 1.0);
      auVar64 = ZEXT812(0);
      auVar339 = ZEXT1228(auVar64) << 0x20;
      auVar108 = vcmpps_avx(auVar110,ZEXT1232(auVar64) << 0x20,1);
      auVar108 = vorps_avx(auVar18,auVar108);
      auVar347._8_4_ = 0xff800000;
      auVar347._0_8_ = 0xff800000ff800000;
      auVar347._12_4_ = 0xff800000;
      auVar347._16_4_ = 0xff800000;
      auVar347._20_4_ = 0xff800000;
      auVar347._24_4_ = 0xff800000;
      auVar347._28_4_ = 0xff800000;
      auVar108 = vblendvps_avx(auVar41,auVar347,auVar108);
      auVar377 = vcmpps_avx(auVar110,ZEXT1232(auVar64) << 0x20,6);
      auVar377 = vorps_avx(auVar18,auVar377);
      auVar357._8_4_ = 0x7f800000;
      auVar357._0_8_ = 0x7f8000007f800000;
      auVar357._12_4_ = 0x7f800000;
      auVar357._16_4_ = 0x7f800000;
      auVar357._20_4_ = 0x7f800000;
      auVar357._24_4_ = 0x7f800000;
      auVar357._28_4_ = 0x7f800000;
      auVar358 = ZEXT3264(auVar357);
      auVar377 = vblendvps_avx(auVar41,auVar357,auVar377);
      auVar18 = vmaxps_avx(local_3e0,auVar208);
      auVar18 = vmaxps_avx(auVar18,auVar108);
      auVar377 = vminps_avx(local_5c0,auVar377);
      auVar342 = ZEXT1232(auVar64) << 0x20;
      auVar108 = vsubps_avx(auVar342,auVar152);
      auVar152 = vsubps_avx(auVar342,local_a20);
      auVar42._4_4_ = auVar152._4_4_ * -fVar379;
      auVar42._0_4_ = auVar152._0_4_ * -fVar371;
      auVar42._8_4_ = auVar152._8_4_ * -fVar382;
      auVar42._12_4_ = auVar152._12_4_ * -fVar384;
      auVar42._16_4_ = auVar152._16_4_ * -fVar386;
      auVar42._20_4_ = auVar152._20_4_ * -fVar388;
      auVar42._24_4_ = auVar152._24_4_ * -fVar390;
      auVar42._28_4_ = auVar152._28_4_;
      auVar43._4_4_ = fVar216 * auVar108._4_4_;
      auVar43._0_4_ = fVar214 * auVar108._0_4_;
      auVar43._8_4_ = fVar240 * auVar108._8_4_;
      auVar43._12_4_ = fVar271 * auVar108._12_4_;
      auVar43._16_4_ = fVar294 * auVar108._16_4_;
      auVar43._20_4_ = fVar277 * auVar108._20_4_;
      auVar43._24_4_ = fVar13 * auVar108._24_4_;
      auVar43._28_4_ = auVar108._28_4_;
      auVar108 = vsubps_avx(auVar42,auVar43);
      auVar152 = vsubps_avx(auVar342,auVar16);
      auVar44._4_4_ = fVar217 * auVar152._4_4_;
      auVar44._0_4_ = fVar272 * auVar152._0_4_;
      auVar44._8_4_ = fVar242 * auVar152._8_4_;
      auVar44._12_4_ = fVar273 * auVar152._12_4_;
      auVar44._16_4_ = fVar297 * auVar152._16_4_;
      auVar44._20_4_ = fVar369 * auVar152._20_4_;
      uVar2 = auVar152._28_4_;
      auVar44._24_4_ = fVar14 * auVar152._24_4_;
      auVar44._28_4_ = uVar2;
      auVar20 = vsubps_avx(auVar108,auVar44);
      auVar45._4_4_ = (float)local_800._4_4_ * -fVar379;
      auVar45._0_4_ = (float)local_800._0_4_ * -fVar371;
      auVar45._8_4_ = fStack_7f8 * -fVar382;
      auVar45._12_4_ = fStack_7f4 * -fVar384;
      auVar45._16_4_ = fStack_7f0 * -fVar386;
      auVar45._20_4_ = fStack_7ec * -fVar388;
      auVar45._24_4_ = fStack_7e8 * -fVar390;
      auVar45._28_4_ = uVar8 ^ 0x80000000;
      auVar46._4_4_ = (float)local_7e0._4_4_ * fVar216;
      auVar46._0_4_ = (float)local_7e0._0_4_ * fVar214;
      auVar46._8_4_ = fStack_7d8 * fVar240;
      auVar46._12_4_ = fStack_7d4 * fVar271;
      auVar46._16_4_ = fStack_7d0 * fVar294;
      auVar46._20_4_ = fStack_7cc * fVar277;
      auVar46._24_4_ = fStack_7c8 * fVar13;
      auVar46._28_4_ = uVar2;
      auVar108 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar217 * (float)local_7c0._4_4_;
      auVar47._0_4_ = fVar272 * (float)local_7c0._0_4_;
      auVar47._8_4_ = fVar242 * fStack_7b8;
      auVar47._12_4_ = fVar273 * fStack_7b4;
      auVar47._16_4_ = fVar297 * fStack_7b0;
      auVar47._20_4_ = fVar369 * fStack_7ac;
      auVar47._24_4_ = fVar14 * fStack_7a8;
      auVar47._28_4_ = uVar2;
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = &DAT_3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar236._16_4_ = 0x3f800000;
      auVar236._20_4_ = 0x3f800000;
      auVar236._24_4_ = 0x3f800000;
      auVar236._28_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar108,auVar47);
      auVar108 = vrcpps_avx(auVar21);
      fVar214 = auVar108._0_4_;
      fVar272 = auVar108._4_4_;
      auVar48._4_4_ = auVar21._4_4_ * fVar272;
      auVar48._0_4_ = auVar21._0_4_ * fVar214;
      fVar215 = auVar108._8_4_;
      auVar48._8_4_ = auVar21._8_4_ * fVar215;
      fVar278 = auVar108._12_4_;
      auVar48._12_4_ = auVar21._12_4_ * fVar278;
      fVar216 = auVar108._16_4_;
      auVar48._16_4_ = auVar21._16_4_ * fVar216;
      fVar217 = auVar108._20_4_;
      auVar48._20_4_ = auVar21._20_4_ * fVar217;
      fVar218 = auVar108._24_4_;
      auVar48._24_4_ = auVar21._24_4_ * fVar218;
      auVar48._28_4_ = fStack_7a4;
      auVar22 = vsubps_avx(auVar236,auVar48);
      auVar111._8_4_ = 0x7fffffff;
      auVar111._0_8_ = 0x7fffffff7fffffff;
      auVar111._12_4_ = 0x7fffffff;
      auVar111._16_4_ = 0x7fffffff;
      auVar111._20_4_ = 0x7fffffff;
      auVar111._24_4_ = 0x7fffffff;
      auVar111._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar21,auVar111);
      auVar152 = vcmpps_avx(auVar108,auVar394,1);
      auVar49._4_4_ = (fVar272 + fVar272 * auVar22._4_4_) * -auVar20._4_4_;
      auVar49._0_4_ = (fVar214 + fVar214 * auVar22._0_4_) * -auVar20._0_4_;
      auVar49._8_4_ = (fVar215 + fVar215 * auVar22._8_4_) * -auVar20._8_4_;
      auVar49._12_4_ = (fVar278 + fVar278 * auVar22._12_4_) * -auVar20._12_4_;
      auVar49._16_4_ = (fVar216 + fVar216 * auVar22._16_4_) * -auVar20._16_4_;
      auVar49._20_4_ = (fVar217 + fVar217 * auVar22._20_4_) * -auVar20._20_4_;
      auVar49._24_4_ = (fVar218 + fVar218 * auVar22._24_4_) * -auVar20._24_4_;
      auVar49._28_4_ = auVar20._28_4_ ^ 0x80000000;
      auVar108 = vcmpps_avx(auVar21,auVar342,1);
      auVar108 = vorps_avx(auVar152,auVar108);
      auVar112._8_4_ = 0xff800000;
      auVar112._0_8_ = 0xff800000ff800000;
      auVar112._12_4_ = 0xff800000;
      auVar112._16_4_ = 0xff800000;
      auVar112._20_4_ = 0xff800000;
      auVar112._24_4_ = 0xff800000;
      auVar112._28_4_ = 0xff800000;
      auVar108 = vblendvps_avx(auVar49,auVar112,auVar108);
      _local_9e0 = vmaxps_avx(auVar18,auVar108);
      auVar108 = vcmpps_avx(auVar21,ZEXT1232(auVar64) << 0x20,6);
      auVar108 = vorps_avx(auVar152,auVar108);
      auVar108 = vblendvps_avx(auVar49,auVar357,auVar108);
      auVar107 = vandps_avx(local_3c0,auVar107);
      local_440 = vminps_avx(auVar377,auVar108);
      auVar108 = vcmpps_avx(_local_9e0,local_440,2);
      auVar152 = auVar107 & auVar108;
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar152 >> 0x7f,0) == '\0') &&
            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar152 >> 0xbf,0) == '\0') &&
          (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar152[0x1f]) {
LAB_00f1e064:
        auVar289 = ZEXT3264(_local_900);
      }
      else {
        auVar152 = vminps_avx(local_760,local_620);
        auVar377 = vminps_avx(local_780,local_7a0);
        auVar152 = vminps_avx(auVar152,auVar377);
        auVar17 = vsubps_avx(auVar152,auVar17);
        auVar107 = vandps_avx(auVar108,auVar107);
        auVar80._4_4_ = local_500[1];
        auVar80._0_4_ = local_500[0];
        auVar80._8_4_ = local_500[2];
        auVar80._12_4_ = local_500[3];
        auVar80._16_4_ = fStack_4f0;
        auVar80._20_4_ = fStack_4ec;
        auVar80._24_4_ = fStack_4e8;
        auVar80._28_4_ = fStack_4e4;
        auVar108 = vminps_avx(auVar80,auVar236);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_500[0] = fVar89 + fVar135 * (auVar108._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar118 + fVar168 * (auVar108._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar121 + fVar169 * (auVar108._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar124 + fVar171 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar89 + fVar135 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar118 + fVar168 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar121 + fVar169 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar124 + auVar108._28_4_ + 7.0;
        auVar79._4_4_ = local_520[1];
        auVar79._0_4_ = local_520[0];
        auVar79._8_4_ = local_520[2];
        auVar79._12_4_ = local_520[3];
        auVar79._16_4_ = fStack_510;
        auVar79._20_4_ = fStack_50c;
        auVar79._24_4_ = fStack_508;
        auVar79._28_4_ = fStack_504;
        auVar108 = vminps_avx(auVar79,auVar236);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_520[0] = fVar89 + fVar135 * (auVar108._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar118 + fVar168 * (auVar108._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar121 + fVar169 * (auVar108._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar124 + fVar171 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar89 + fVar135 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar118 + fVar168 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar121 + fVar169 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar124 + auVar108._28_4_ + 7.0;
        auVar50._4_4_ = auVar17._4_4_ * 0.99999976;
        auVar50._0_4_ = auVar17._0_4_ * 0.99999976;
        auVar50._8_4_ = auVar17._8_4_ * 0.99999976;
        auVar50._12_4_ = auVar17._12_4_ * 0.99999976;
        auVar50._16_4_ = auVar17._16_4_ * 0.99999976;
        auVar50._20_4_ = auVar17._20_4_ * 0.99999976;
        auVar50._24_4_ = auVar17._24_4_ * 0.99999976;
        auVar50._28_4_ = 0x3f7ffffc;
        auVar108 = vmaxps_avx(ZEXT1232(auVar64) << 0x20,auVar50);
        auVar51._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar51._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar51._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar51._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar51._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar51._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar51._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar51._28_4_ = auVar108._28_4_;
        local_ac0 = vsubps_avx(auVar19,auVar51);
        auVar52._4_4_ = local_ac0._4_4_ * fVar170 * 4.0;
        auVar52._0_4_ = local_ac0._0_4_ * fVar249 * 4.0;
        auVar52._8_4_ = local_ac0._8_4_ * fVar172 * 4.0;
        auVar52._12_4_ = local_ac0._12_4_ * fVar173 * 4.0;
        auVar52._16_4_ = local_ac0._16_4_ * fVar174 * 4.0;
        auVar52._20_4_ = local_ac0._20_4_ * fVar175 * 4.0;
        auVar52._24_4_ = local_ac0._24_4_ * fVar343 * 4.0;
        auVar52._28_4_ = auVar108._28_4_;
        auVar17 = vsubps_avx(auVar34,auVar52);
        _local_8a0 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_8e0 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
        auVar108 = local_8e0;
        if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8e0 >> 0x7f,0) == '\0') &&
              (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0xbf,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8e0[0x1f]) {
          _local_640 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar205 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar233 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          local_ac0 = auVar16;
          local_8e0 = auVar23;
          _local_860 = _local_8a0;
        }
        else {
          auVar16 = vsqrtps_avx(auVar17);
          auVar155._0_4_ = fVar249 + fVar249;
          auVar155._4_4_ = fVar170 + fVar170;
          auVar155._8_4_ = fVar172 + fVar172;
          auVar155._12_4_ = fVar173 + fVar173;
          auVar155._16_4_ = fVar174 + fVar174;
          auVar155._20_4_ = fVar175 + fVar175;
          auVar155._24_4_ = fVar343 + fVar343;
          auVar155._28_4_ = fVar194 + fVar194;
          auVar152 = vrcpps_avx(auVar155);
          fVar194 = auVar152._0_4_;
          fVar214 = auVar152._4_4_;
          auVar53._4_4_ = auVar155._4_4_ * fVar214;
          auVar53._0_4_ = auVar155._0_4_ * fVar194;
          fVar272 = auVar152._8_4_;
          auVar53._8_4_ = auVar155._8_4_ * fVar272;
          fVar215 = auVar152._12_4_;
          auVar53._12_4_ = auVar155._12_4_ * fVar215;
          fVar278 = auVar152._16_4_;
          auVar53._16_4_ = auVar155._16_4_ * fVar278;
          fVar216 = auVar152._20_4_;
          auVar53._20_4_ = auVar155._20_4_ * fVar216;
          fVar217 = auVar152._24_4_;
          auVar53._24_4_ = auVar155._24_4_ * fVar217;
          auVar53._28_4_ = auVar155._28_4_;
          auVar377 = vsubps_avx(auVar236,auVar53);
          fVar194 = fVar194 + fVar194 * auVar377._0_4_;
          fVar214 = fVar214 + fVar214 * auVar377._4_4_;
          fVar272 = fVar272 + fVar272 * auVar377._8_4_;
          fVar215 = fVar215 + fVar215 * auVar377._12_4_;
          fVar278 = fVar278 + fVar278 * auVar377._16_4_;
          fVar216 = fVar216 + fVar216 * auVar377._20_4_;
          fVar217 = fVar217 + fVar217 * auVar377._24_4_;
          fVar273 = auVar152._28_4_ + auVar377._28_4_;
          auVar156._0_8_ = local_5a0._0_8_ ^ 0x8000000080000000;
          auVar156._8_4_ = -local_5a0._8_4_;
          auVar156._12_4_ = -local_5a0._12_4_;
          auVar156._16_4_ = -local_5a0._16_4_;
          auVar156._20_4_ = -local_5a0._20_4_;
          auVar156._24_4_ = -local_5a0._24_4_;
          auVar156._28_4_ = -local_5a0._28_4_;
          auVar152 = vsubps_avx(auVar156,auVar16);
          fVar218 = auVar152._0_4_ * fVar194;
          fVar219 = auVar152._4_4_ * fVar214;
          auVar54._4_4_ = fVar219;
          auVar54._0_4_ = fVar218;
          fVar240 = auVar152._8_4_ * fVar272;
          auVar54._8_4_ = fVar240;
          fVar242 = auVar152._12_4_ * fVar215;
          auVar54._12_4_ = fVar242;
          fVar244 = auVar152._16_4_ * fVar278;
          auVar54._16_4_ = fVar244;
          fVar246 = auVar152._20_4_ * fVar216;
          auVar54._20_4_ = fVar246;
          fVar271 = auVar152._24_4_ * fVar217;
          auVar54._24_4_ = fVar271;
          auVar54._28_4_ = auVar152._28_4_;
          auVar152 = vsubps_avx(auVar16,local_5a0);
          fVar194 = auVar152._0_4_ * fVar194;
          fVar214 = auVar152._4_4_ * fVar214;
          auVar55._4_4_ = fVar214;
          auVar55._0_4_ = fVar194;
          fVar272 = auVar152._8_4_ * fVar272;
          auVar55._8_4_ = fVar272;
          fVar215 = auVar152._12_4_ * fVar215;
          auVar55._12_4_ = fVar215;
          fVar278 = auVar152._16_4_ * fVar278;
          auVar55._16_4_ = fVar278;
          fVar216 = auVar152._20_4_ * fVar216;
          auVar55._20_4_ = fVar216;
          fVar217 = auVar152._24_4_ * fVar217;
          auVar55._24_4_ = fVar217;
          auVar55._28_4_ = 0x3f800000;
          auVar9._4_4_ = fStack_3fc;
          auVar9._0_4_ = local_400;
          auVar9._8_4_ = fStack_3f8;
          auVar9._12_4_ = fStack_3f4;
          auVar9._16_4_ = fStack_3f0;
          auVar9._20_4_ = fStack_3ec;
          auVar9._24_4_ = fStack_3e8;
          auVar9._28_4_ = fStack_3e4;
          fVar274 = local_400 * (fVar218 * fVar326 + fVar344);
          fVar275 = fStack_3fc * (fVar219 * fVar330 + fVar348);
          fVar294 = fStack_3f8 * (fVar240 * fVar331 + fVar349);
          fVar297 = fStack_3f4 * (fVar242 * fVar332 + fVar350);
          fVar299 = fStack_3f0 * (fVar244 * fVar333 + fVar351);
          fVar301 = fStack_3ec * (fVar246 * fVar334 + fVar352);
          fVar277 = fStack_3e8 * (fVar271 * fVar335 + fVar353);
          auVar210._0_4_ = fVar90 + fVar270 * fVar274;
          auVar210._4_4_ = fVar119 + fVar296 * fVar275;
          auVar210._8_4_ = fVar122 + fVar239 * fVar294;
          auVar210._12_4_ = fVar125 + fVar269 * fVar297;
          auVar210._16_4_ = fVar127 + fVar291 * fVar299;
          auVar210._20_4_ = fVar129 + fVar391 * fVar301;
          auVar210._24_4_ = fVar131 + fVar12 * fVar277;
          auVar210._28_4_ = fVar133 + auVar152._28_4_ + fVar354;
          auVar56._4_4_ = (float)local_7c0._4_4_ * fVar219;
          auVar56._0_4_ = (float)local_7c0._0_4_ * fVar218;
          auVar56._8_4_ = fStack_7b8 * fVar240;
          auVar56._12_4_ = fStack_7b4 * fVar242;
          auVar56._16_4_ = fStack_7b0 * fVar244;
          auVar56._20_4_ = fStack_7ac * fVar246;
          auVar56._24_4_ = fStack_7a8 * fVar271;
          auVar56._28_4_ = fVar273;
          local_a20 = vsubps_avx(auVar56,auVar210);
          auVar235._0_4_ = fVar91 + fVar268 * fVar274;
          auVar235._4_4_ = fVar120 + fVar290 * fVar275;
          auVar235._8_4_ = fVar123 + fVar220 * fVar294;
          auVar235._12_4_ = fVar126 + fVar248 * fVar297;
          auVar235._16_4_ = fVar128 + fVar276 * fVar299;
          auVar235._20_4_ = fVar130 + fVar303 * fVar301;
          auVar235._24_4_ = fVar132 + fVar10 * fVar277;
          auVar235._28_4_ = fVar134 + fVar273;
          auVar57._4_4_ = (float)local_7e0._4_4_ * fVar219;
          auVar57._0_4_ = (float)local_7e0._0_4_ * fVar218;
          auVar57._8_4_ = fStack_7d8 * fVar240;
          auVar57._12_4_ = fStack_7d4 * fVar242;
          auVar57._16_4_ = fStack_7d0 * fVar244;
          auVar57._20_4_ = fStack_7cc * fVar246;
          auVar57._24_4_ = fStack_7c8 * fVar271;
          auVar57._28_4_ = fVar124;
          _local_ae0 = vsubps_avx(auVar57,auVar235);
          auVar262._0_4_ = (float)local_640._0_4_ + fVar213 * fVar274;
          auVar262._4_4_ = (float)local_640._4_4_ + fVar293 * fVar275;
          auVar262._8_4_ = fStack_638 + fVar221 * fVar294;
          auVar262._12_4_ = fStack_634 + fVar251 * fVar297;
          auVar262._16_4_ = fStack_630 + fVar279 * fVar299;
          auVar262._20_4_ = fStack_62c + fVar359 * fVar301;
          auVar262._24_4_ = fStack_628 + fVar11 * fVar277;
          auVar262._28_4_ = fStack_624 + 0.0;
          auVar58._4_4_ = (float)local_800._4_4_ * fVar219;
          auVar58._0_4_ = (float)local_800._0_4_ * fVar218;
          auVar58._8_4_ = fStack_7f8 * fVar240;
          auVar58._12_4_ = fStack_7f4 * fVar242;
          auVar58._16_4_ = fStack_7f0 * fVar244;
          auVar58._20_4_ = fStack_7ec * fVar246;
          auVar58._24_4_ = fStack_7e8 * fVar271;
          auVar58._28_4_ = fVar124;
          local_b00 = vsubps_avx(auVar58,auVar262);
          fVar218 = local_400 * (fVar194 * fVar326 + fVar344);
          fVar219 = fStack_3fc * (fVar214 * fVar330 + fVar348);
          fVar240 = fStack_3f8 * (fVar272 * fVar331 + fVar349);
          fVar242 = fStack_3f4 * (fVar215 * fVar332 + fVar350);
          fVar244 = fStack_3f0 * (fVar278 * fVar333 + fVar351);
          fVar246 = fStack_3ec * (fVar216 * fVar334 + fVar352);
          fVar271 = fStack_3e8 * (fVar217 * fVar335 + fVar353);
          auVar287._0_4_ = fVar90 + fVar270 * fVar218;
          auVar287._4_4_ = fVar119 + fVar296 * fVar219;
          auVar287._8_4_ = fVar122 + fVar239 * fVar240;
          auVar287._12_4_ = fVar125 + fVar269 * fVar242;
          auVar287._16_4_ = fVar127 + fVar291 * fVar244;
          auVar287._20_4_ = fVar129 + fVar391 * fVar246;
          auVar287._24_4_ = fVar131 + fVar12 * fVar271;
          auVar287._28_4_ = fVar133 + fVar124;
          auVar59._4_4_ = fVar214 * (float)local_7c0._4_4_;
          auVar59._0_4_ = fVar194 * (float)local_7c0._0_4_;
          auVar59._8_4_ = fVar272 * fStack_7b8;
          auVar59._12_4_ = fVar215 * fStack_7b4;
          auVar59._16_4_ = fVar278 * fStack_7b0;
          auVar59._20_4_ = fVar216 * fStack_7ac;
          auVar59._24_4_ = fVar217 * fStack_7a8;
          auVar59._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar59,auVar287);
          auVar288._0_4_ = fVar91 + fVar268 * fVar218;
          auVar288._4_4_ = fVar120 + fVar290 * fVar219;
          auVar288._8_4_ = fVar123 + fVar220 * fVar240;
          auVar288._12_4_ = fVar126 + fVar248 * fVar242;
          auVar288._16_4_ = fVar128 + fVar276 * fVar244;
          auVar288._20_4_ = fVar130 + fVar303 * fVar246;
          auVar288._24_4_ = fVar132 + fVar10 * fVar271;
          auVar288._28_4_ = fVar134 + local_8a0._28_4_;
          auVar60._4_4_ = (float)local_7e0._4_4_ * fVar214;
          auVar60._0_4_ = (float)local_7e0._0_4_ * fVar194;
          auVar60._8_4_ = fStack_7d8 * fVar272;
          auVar60._12_4_ = fStack_7d4 * fVar215;
          auVar60._16_4_ = fStack_7d0 * fVar278;
          auVar60._20_4_ = fStack_7cc * fVar216;
          auVar60._24_4_ = fStack_7c8 * fVar217;
          auVar60._28_4_ = fStack_7a4;
          _local_860 = vsubps_avx(auVar60,auVar288);
          auVar263._0_4_ = (float)local_640._0_4_ + fVar213 * fVar218;
          auVar263._4_4_ = (float)local_640._4_4_ + fVar293 * fVar219;
          auVar263._8_4_ = fStack_638 + fVar221 * fVar240;
          auVar263._12_4_ = fStack_634 + fVar251 * fVar242;
          auVar263._16_4_ = fStack_630 + fVar279 * fVar244;
          auVar263._20_4_ = fStack_62c + fVar359 * fVar246;
          auVar263._24_4_ = fStack_628 + fVar11 * fVar271;
          auVar263._28_4_ = fStack_624 + local_b00._28_4_ + fVar354;
          auVar61._4_4_ = (float)local_800._4_4_ * fVar214;
          auVar61._0_4_ = (float)local_800._0_4_ * fVar194;
          auVar61._8_4_ = fStack_7f8 * fVar272;
          auVar61._12_4_ = fStack_7f4 * fVar215;
          auVar61._16_4_ = fStack_7f0 * fVar278;
          auVar61._20_4_ = fStack_7ec * fVar216;
          auVar61._24_4_ = fStack_7e8 * fVar217;
          auVar61._28_4_ = local_860._28_4_;
          _local_640 = vsubps_avx(auVar61,auVar263);
          auVar152 = vcmpps_avx(auVar17,_DAT_02020f00,5);
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar154 = vblendvps_avx(auVar264,auVar54,auVar152);
          auVar312._8_4_ = 0x7fffffff;
          auVar312._0_8_ = 0x7fffffff7fffffff;
          auVar312._12_4_ = 0x7fffffff;
          auVar312._16_4_ = 0x7fffffff;
          auVar312._20_4_ = 0x7fffffff;
          auVar312._24_4_ = 0x7fffffff;
          auVar312._28_4_ = 0x7fffffff;
          auVar17 = vandps_avx(auVar312,local_420);
          auVar17 = vmaxps_avx(local_4c0,auVar17);
          auVar62._4_4_ = auVar17._4_4_ * 1.9073486e-06;
          auVar62._0_4_ = auVar17._0_4_ * 1.9073486e-06;
          auVar62._8_4_ = auVar17._8_4_ * 1.9073486e-06;
          auVar62._12_4_ = auVar17._12_4_ * 1.9073486e-06;
          auVar62._16_4_ = auVar17._16_4_ * 1.9073486e-06;
          auVar62._20_4_ = auVar17._20_4_ * 1.9073486e-06;
          auVar62._24_4_ = auVar17._24_4_ * 1.9073486e-06;
          auVar62._28_4_ = auVar17._28_4_;
          auVar17 = vandps_avx(auVar312,local_660);
          auVar17 = vcmpps_avx(auVar17,auVar62,1);
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar261 = vblendvps_avx(auVar265,auVar55,auVar152);
          auVar16 = auVar152 & auVar17;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar17,auVar152);
            auVar138 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar377 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar16 = vcmpps_avx(local_ac0,auVar377,2);
            auVar395._8_4_ = 0xff800000;
            auVar395._0_8_ = 0xff800000ff800000;
            auVar395._12_4_ = 0xff800000;
            auVar395._16_4_ = 0xff800000;
            auVar395._20_4_ = 0xff800000;
            auVar395._24_4_ = 0xff800000;
            auVar395._28_4_ = 0xff800000;
            auVar397._8_4_ = 0x7f800000;
            auVar397._0_8_ = 0x7f8000007f800000;
            auVar397._12_4_ = 0x7f800000;
            auVar397._16_4_ = 0x7f800000;
            auVar397._20_4_ = 0x7f800000;
            auVar397._24_4_ = 0x7f800000;
            auVar397._28_4_ = 0x7f800000;
            auVar17 = vblendvps_avx(auVar397,auVar395,auVar16);
            auVar142 = vpmovsxwd_avx(auVar138);
            auVar138 = vpunpckhwd_avx(auVar138,auVar138);
            auVar313._16_16_ = auVar138;
            auVar313._0_16_ = auVar142;
            auVar154 = vblendvps_avx(auVar154,auVar17,auVar313);
            auVar9 = vblendvps_avx(auVar395,auVar397,auVar16);
            auVar261 = vblendvps_avx(auVar261,auVar9,auVar313);
            auVar17 = vcmpps_avx(auVar377,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar193._0_4_ = auVar108._0_4_ ^ auVar17._0_4_;
            auVar193._4_4_ = auVar108._4_4_ ^ auVar17._4_4_;
            auVar193._8_4_ = auVar108._8_4_ ^ auVar17._8_4_;
            auVar193._12_4_ = auVar108._12_4_ ^ auVar17._12_4_;
            auVar193._16_4_ = auVar108._16_4_ ^ auVar17._16_4_;
            auVar193._20_4_ = auVar108._20_4_ ^ auVar17._20_4_;
            auVar193._24_4_ = auVar108._24_4_ ^ auVar17._24_4_;
            auVar193._28_4_ = auVar108._28_4_ ^ auVar17._28_4_;
            auVar108 = vorps_avx(auVar16,auVar193);
            auVar108 = vandps_avx(auVar152,auVar108);
          }
          auVar358 = ZEXT3264(auVar9);
          auVar205 = local_a20._0_28_;
          auVar233 = local_ae0._0_28_;
          auVar339 = local_b00._0_28_;
        }
        _local_4a0 = _local_9e0;
        local_480 = vminps_avx(local_440,auVar154);
        _local_820 = vmaxps_avx(_local_9e0,auVar261);
        _local_460 = _local_820;
        auVar17 = vcmpps_avx(_local_9e0,local_480,2);
        local_540 = vandps_avx(auVar107,auVar17);
        local_5e0 = local_540;
        auVar17 = vcmpps_avx(_local_820,local_440,2);
        local_600 = vandps_avx(auVar107,auVar17);
        auVar107 = vorps_avx(local_600,local_540);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = &DAT_3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar236._16_4_ = 0x3f800000;
          auVar236._20_4_ = 0x3f800000;
          auVar236._24_4_ = 0x3f800000;
          auVar236._28_4_ = 0x3f800000;
          goto LAB_00f1e064;
        }
        local_580 = local_600;
        local_880 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar108._0_4_ ^ local_880._0_4_;
        local_5c0._4_4_ = auVar108._4_4_ ^ local_880._4_4_;
        local_5c0._8_4_ = auVar108._8_4_ ^ local_880._8_4_;
        local_5c0._12_4_ = auVar108._12_4_ ^ local_880._12_4_;
        local_5c0._16_4_ = auVar108._16_4_ ^ local_880._16_4_;
        local_5c0._20_4_ = auVar108._20_4_ ^ local_880._20_4_;
        local_5c0._24_4_ = auVar108._24_4_ ^ local_880._24_4_;
        local_5c0._28_4_ = (uint)auVar108._28_4_ ^ (uint)local_880._28_4_;
        auVar114._0_4_ =
             auVar205._0_4_ * (float)local_7c0._0_4_ +
             auVar233._0_4_ * (float)local_7e0._0_4_ + auVar339._0_4_ * (float)local_800._0_4_;
        auVar114._4_4_ =
             auVar205._4_4_ * (float)local_7c0._4_4_ +
             auVar233._4_4_ * (float)local_7e0._4_4_ + auVar339._4_4_ * (float)local_800._4_4_;
        auVar114._8_4_ =
             auVar205._8_4_ * fStack_7b8 + auVar233._8_4_ * fStack_7d8 + auVar339._8_4_ * fStack_7f8
        ;
        auVar114._12_4_ =
             auVar205._12_4_ * fStack_7b4 +
             auVar233._12_4_ * fStack_7d4 + auVar339._12_4_ * fStack_7f4;
        auVar114._16_4_ =
             auVar205._16_4_ * fStack_7b0 +
             auVar233._16_4_ * fStack_7d0 + auVar339._16_4_ * fStack_7f0;
        auVar114._20_4_ =
             auVar205._20_4_ * fStack_7ac +
             auVar233._20_4_ * fStack_7cc + auVar339._20_4_ * fStack_7ec;
        auVar114._24_4_ =
             auVar205._24_4_ * fStack_7a8 +
             auVar233._24_4_ * fStack_7c8 + auVar339._24_4_ * fStack_7e8;
        auVar114._28_4_ = local_880._28_4_ + local_540._28_4_ + auVar108._28_4_;
        auVar157._8_4_ = 0x7fffffff;
        auVar157._0_8_ = 0x7fffffff7fffffff;
        auVar157._12_4_ = 0x7fffffff;
        auVar157._16_4_ = 0x7fffffff;
        auVar157._20_4_ = 0x7fffffff;
        auVar157._24_4_ = 0x7fffffff;
        auVar157._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar114,auVar157);
        auVar158._8_4_ = 0x3e99999a;
        auVar158._0_8_ = 0x3e99999a3e99999a;
        auVar158._12_4_ = 0x3e99999a;
        auVar158._16_4_ = 0x3e99999a;
        auVar158._20_4_ = 0x3e99999a;
        auVar158._24_4_ = 0x3e99999a;
        auVar158._28_4_ = 0x3e99999a;
        auVar107 = vcmpps_avx(auVar107,auVar158,1);
        auVar107 = vorps_avx(auVar107,local_5c0);
        auVar159._8_4_ = 3;
        auVar159._0_8_ = 0x300000003;
        auVar159._12_4_ = 3;
        auVar159._16_4_ = 3;
        auVar159._20_4_ = 3;
        auVar159._24_4_ = 3;
        auVar159._28_4_ = 3;
        auVar188._8_4_ = 2;
        auVar188._0_8_ = 0x200000002;
        auVar188._12_4_ = 2;
        auVar188._16_4_ = 2;
        auVar188._20_4_ = 2;
        auVar188._24_4_ = 2;
        auVar188._28_4_ = 2;
        auVar107 = vblendvps_avx(auVar188,auVar159,auVar107);
        local_5a0 = ZEXT432((uint)uVar86);
        auVar142 = vpshufd_avx(ZEXT416((uint)uVar86),0);
        auVar138 = vpcmpgtd_avx(auVar107._16_16_,auVar142);
        local_660._0_16_ = auVar142;
        auVar142 = vpcmpgtd_avx(auVar107._0_16_,auVar142);
        auVar160._16_16_ = auVar138;
        auVar160._0_16_ = auVar142;
        local_560 = vblendps_avx(ZEXT1632(auVar142),auVar160,0xf0);
        local_5e0 = vandnps_avx(local_560,local_540);
        auVar107 = local_540 & ~local_560;
        auVar212 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_620._0_8_ = uVar86;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          local_840._4_4_ = (float)local_9e0._4_4_ + (float)local_900._4_4_;
          local_840._0_4_ = (float)local_9e0._0_4_ + (float)local_900._0_4_;
          fStack_838 = fStack_9d8 + fStack_8f8;
          fStack_834 = fStack_9d4 + fStack_8f4;
          fStack_830 = fStack_9d0 + fStack_8f0;
          fStack_82c = fStack_9cc + fStack_8ec;
          fStack_828 = fStack_9c8 + fStack_8e8;
          fStack_824 = fStack_9c4 + fStack_8e4;
          do {
            auVar225 = auVar212._0_16_;
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar161,_local_9e0,local_5e0);
            auVar108 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar108 = vminps_avx(auVar107,auVar108);
            auVar17 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar17);
            auVar17 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar17);
            auVar108 = vcmpps_avx(auVar107,auVar108,0);
            auVar17 = local_5e0 & auVar108;
            auVar107 = local_5e0;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar108,local_5e0);
            }
            uVar85 = vmovmskps_avx(auVar107);
            uVar8 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar86 = (ulong)uVar8;
            *(undefined4 *)(local_5e0 + uVar86 * 4) = 0;
            fVar194 = local_500[uVar86];
            uVar8 = *(uint *)(local_4a0 + uVar86 * 4);
            fVar268 = local_b04;
            if ((float)local_920._0_4_ < 0.0) {
              fVar268 = sqrtf((float)local_920._0_4_);
              auVar225._8_4_ = 0x7fffffff;
              auVar225._0_8_ = 0x7fffffff7fffffff;
              auVar225._12_4_ = 0x7fffffff;
            }
            auVar238 = ZEXT464(uVar8);
            auVar142 = vminps_avx(_local_a60,_local_a80);
            auVar138 = vmaxps_avx(_local_a60,_local_a80);
            auVar98 = vminps_avx(_local_a70,_local_a90);
            auVar180 = vminps_avx(auVar142,auVar98);
            auVar142 = vmaxps_avx(_local_a70,_local_a90);
            auVar98 = vmaxps_avx(auVar138,auVar142);
            auVar138 = vandps_avx(auVar180,auVar225);
            auVar142 = vandps_avx(auVar98,auVar225);
            auVar138 = vmaxps_avx(auVar138,auVar142);
            auVar142 = vmovshdup_avx(auVar138);
            auVar142 = vmaxss_avx(auVar142,auVar138);
            auVar138 = vshufpd_avx(auVar138,auVar138,1);
            auVar138 = vmaxss_avx(auVar138,auVar142);
            local_a20._0_4_ = auVar138._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar268 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar98,auVar98,0xff);
            lVar83 = 4;
            do {
              local_b00._0_4_ = 1.0 - fVar194;
              auVar138 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
              fVar268 = auVar138._0_4_;
              fVar213 = auVar138._4_4_;
              fVar270 = auVar138._8_4_;
              fVar214 = auVar138._12_4_;
              auVar138 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_),0
                                    );
              fVar272 = auVar138._0_4_;
              fVar215 = auVar138._4_4_;
              fVar278 = auVar138._8_4_;
              fVar290 = auVar138._12_4_;
              fVar293 = (float)local_a70._0_4_ * fVar268 + (float)local_a80._0_4_ * fVar272;
              fVar296 = (float)local_a70._4_4_ * fVar213 + (float)local_a80._4_4_ * fVar215;
              fVar216 = fStack_a68 * fVar270 + fStack_a78 * fVar278;
              fVar217 = fStack_a64 * fVar214 + fStack_a74 * fVar290;
              auVar254._0_4_ =
                   fVar272 * ((float)local_a80._0_4_ * fVar268 + fVar272 * (float)local_a60._0_4_) +
                   fVar268 * fVar293;
              auVar254._4_4_ =
                   fVar215 * ((float)local_a80._4_4_ * fVar213 + fVar215 * (float)local_a60._4_4_) +
                   fVar213 * fVar296;
              auVar254._8_4_ =
                   fVar278 * (fStack_a78 * fVar270 + fVar278 * fStack_a58) + fVar270 * fVar216;
              auVar254._12_4_ =
                   fVar290 * (fStack_a74 * fVar214 + fVar290 * fStack_a54) + fVar214 * fVar217;
              auVar198._0_4_ =
                   fVar272 * fVar293 +
                   fVar268 * (fVar268 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar272);
              auVar198._4_4_ =
                   fVar215 * fVar296 +
                   fVar213 * (fVar213 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar215);
              auVar198._8_4_ =
                   fVar278 * fVar216 + fVar270 * (fVar270 * fStack_a88 + fStack_a68 * fVar278);
              auVar198._12_4_ =
                   fVar290 * fVar217 + fVar214 * (fVar214 * fStack_a84 + fStack_a64 * fVar290);
              auVar138 = vshufps_avx(auVar238._0_16_,auVar238._0_16_,0);
              auVar139._0_4_ = auVar138._0_4_ * (float)local_910._0_4_ + 0.0;
              auVar139._4_4_ = auVar138._4_4_ * (float)local_910._4_4_ + 0.0;
              auVar139._8_4_ = auVar138._8_4_ * fStack_908 + 0.0;
              auVar139._12_4_ = auVar138._12_4_ * fStack_904 + 0.0;
              auVar97._0_4_ = fVar272 * auVar254._0_4_ + fVar268 * auVar198._0_4_;
              auVar97._4_4_ = fVar215 * auVar254._4_4_ + fVar213 * auVar198._4_4_;
              auVar97._8_4_ = fVar278 * auVar254._8_4_ + fVar270 * auVar198._8_4_;
              auVar97._12_4_ = fVar290 * auVar254._12_4_ + fVar214 * auVar198._12_4_;
              local_8e0._0_16_ = auVar97;
              auVar138 = vsubps_avx(auVar139,auVar97);
              _local_ae0 = auVar138;
              auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
              fVar268 = auVar138._0_4_;
              local_bc0 = auVar238._0_4_;
              if (fVar268 < 0.0) {
                local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                local_ac0._0_16_ = auVar254;
                local_940._0_16_ = auVar198;
                fVar213 = sqrtf(fVar268);
                auVar198 = local_940._0_16_;
                auVar254 = local_ac0._0_16_;
              }
              else {
                auVar142 = vsqrtss_avx(auVar138,auVar138);
                fVar213 = auVar142._0_4_;
              }
              auVar142 = vsubps_avx(auVar198,auVar254);
              auVar282._0_4_ = auVar142._0_4_ * 3.0;
              auVar282._4_4_ = auVar142._4_4_ * 3.0;
              auVar282._8_4_ = auVar142._8_4_ * 3.0;
              auVar282._12_4_ = auVar142._12_4_ * 3.0;
              auVar142 = vshufps_avx(ZEXT416((uint)(fVar194 * 6.0)),ZEXT416((uint)(fVar194 * 6.0)),0
                                    );
              auVar98 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar194 + fVar194)) * 6.0));
              auVar180 = vshufps_avx(auVar98,auVar98,0);
              auVar98 = ZEXT416((uint)((fVar194 - ((float)local_b00._0_4_ + (float)local_b00._0_4_))
                                      * 6.0));
              auVar199 = vshufps_avx(auVar98,auVar98,0);
              auVar15 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                    ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
              auVar98 = vdpps_avx(auVar282,auVar282,0x7f);
              auVar140._0_4_ =
                   auVar15._0_4_ * (float)local_a60._0_4_ +
                   auVar199._0_4_ * (float)local_a80._0_4_ +
                   auVar142._0_4_ * (float)local_a90._0_4_ + auVar180._0_4_ * (float)local_a70._0_4_
              ;
              auVar140._4_4_ =
                   auVar15._4_4_ * (float)local_a60._4_4_ +
                   auVar199._4_4_ * (float)local_a80._4_4_ +
                   auVar142._4_4_ * (float)local_a90._4_4_ + auVar180._4_4_ * (float)local_a70._4_4_
              ;
              auVar140._8_4_ =
                   auVar15._8_4_ * fStack_a58 +
                   auVar199._8_4_ * fStack_a78 +
                   auVar142._8_4_ * fStack_a88 + auVar180._8_4_ * fStack_a68;
              auVar140._12_4_ =
                   auVar15._12_4_ * fStack_a54 +
                   auVar199._12_4_ * fStack_a74 +
                   auVar142._12_4_ * fStack_a84 + auVar180._12_4_ * fStack_a64;
              auVar142 = vblendps_avx(auVar98,_DAT_01feba10,0xe);
              auVar180 = vrsqrtss_avx(auVar142,auVar142);
              fVar214 = auVar180._0_4_;
              fVar270 = auVar98._0_4_;
              auVar180 = vdpps_avx(auVar282,auVar140,0x7f);
              auVar199 = vshufps_avx(auVar98,auVar98,0);
              auVar141._0_4_ = auVar140._0_4_ * auVar199._0_4_;
              auVar141._4_4_ = auVar140._4_4_ * auVar199._4_4_;
              auVar141._8_4_ = auVar140._8_4_ * auVar199._8_4_;
              auVar141._12_4_ = auVar140._12_4_ * auVar199._12_4_;
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              auVar226._0_4_ = auVar282._0_4_ * auVar180._0_4_;
              auVar226._4_4_ = auVar282._4_4_ * auVar180._4_4_;
              auVar226._8_4_ = auVar282._8_4_ * auVar180._8_4_;
              auVar226._12_4_ = auVar282._12_4_ * auVar180._12_4_;
              auVar15 = vsubps_avx(auVar141,auVar226);
              auVar180 = vrcpss_avx(auVar142,auVar142);
              auVar142 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                    ZEXT416((uint)(local_bc0 * (float)local_960._0_4_)));
              auVar180 = ZEXT416((uint)(auVar180._0_4_ * (2.0 - fVar270 * auVar180._0_4_)));
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              uVar86 = CONCAT44(auVar282._4_4_,auVar282._0_4_);
              auVar255._0_8_ = uVar86 ^ 0x8000000080000000;
              auVar255._8_4_ = -auVar282._8_4_;
              auVar255._12_4_ = -auVar282._12_4_;
              auVar199 = ZEXT416((uint)(fVar214 * 1.5 + fVar270 * -0.5 * fVar214 * fVar214 * fVar214
                                       ));
              auVar199 = vshufps_avx(auVar199,auVar199,0);
              auVar200._0_4_ = auVar199._0_4_ * auVar15._0_4_ * auVar180._0_4_;
              auVar200._4_4_ = auVar199._4_4_ * auVar15._4_4_ * auVar180._4_4_;
              auVar200._8_4_ = auVar199._8_4_ * auVar15._8_4_ * auVar180._8_4_;
              auVar200._12_4_ = auVar199._12_4_ * auVar15._12_4_ * auVar180._12_4_;
              auVar338._0_4_ = auVar282._0_4_ * auVar199._0_4_;
              auVar338._4_4_ = auVar282._4_4_ * auVar199._4_4_;
              auVar338._8_4_ = auVar282._8_4_ * auVar199._8_4_;
              auVar338._12_4_ = auVar282._12_4_ * auVar199._12_4_;
              local_b00._0_16_ = auVar282;
              local_ac0._0_4_ = auVar142._0_4_;
              if (fVar270 < 0.0) {
                local_940._0_4_ = fVar213;
                local_980._0_16_ = auVar255;
                local_9a0._0_16_ = auVar338;
                local_9c0._0_16_ = auVar200;
                fVar214 = sqrtf(fVar270);
                auVar200 = local_9c0._0_16_;
                auVar255 = local_980._0_16_;
                auVar338 = local_9a0._0_16_;
                fVar270 = (float)local_ac0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                fVar214 = auVar98._0_4_;
                fVar270 = auVar142._0_4_;
                local_940._0_4_ = fVar213;
              }
              auVar142 = vdpps_avx(_local_ae0,auVar338,0x7f);
              fVar213 = ((float)local_a20._0_4_ / fVar214) * ((float)local_940._0_4_ + 1.0) +
                        fVar270 + (float)local_940._0_4_ * (float)local_a20._0_4_;
              auVar98 = vdpps_avx(auVar255,auVar338,0x7f);
              auVar180 = vdpps_avx(_local_ae0,auVar200,0x7f);
              auVar199 = vdpps_avx(_local_910,auVar338,0x7f);
              auVar15 = vdpps_avx(_local_ae0,auVar255,0x7f);
              fVar214 = auVar98._0_4_ + auVar180._0_4_;
              fVar272 = auVar142._0_4_;
              auVar99._0_4_ = fVar272 * fVar272;
              auVar99._4_4_ = auVar142._4_4_ * auVar142._4_4_;
              auVar99._8_4_ = auVar142._8_4_ * auVar142._8_4_;
              auVar99._12_4_ = auVar142._12_4_ * auVar142._12_4_;
              auVar180 = vsubps_avx(auVar138,auVar99);
              local_940._0_16_ = ZEXT416((uint)fVar214);
              auVar98 = vdpps_avx(_local_ae0,_local_910,0x7f);
              fVar215 = auVar15._0_4_ - fVar272 * fVar214;
              fVar272 = auVar98._0_4_ - fVar272 * auVar199._0_4_;
              auVar98 = vrsqrtss_avx(auVar180,auVar180);
              fVar278 = auVar180._0_4_;
              fVar214 = auVar98._0_4_;
              fVar214 = fVar214 * 1.5 + fVar278 * -0.5 * fVar214 * fVar214 * fVar214;
              if (fVar278 < 0.0) {
                local_980._0_16_ = auVar142;
                local_9a0._0_4_ = fVar213;
                local_9c0._0_16_ = auVar199;
                local_740._0_4_ = fVar215;
                local_760._0_4_ = fVar272;
                local_780._0_4_ = fVar214;
                fVar278 = sqrtf(fVar278);
                fVar213 = (float)local_9a0._0_4_;
                fVar214 = (float)local_780._0_4_;
                fVar215 = (float)local_740._0_4_;
                fVar272 = (float)local_760._0_4_;
                auVar199 = local_9c0._0_16_;
                auVar142 = local_980._0_16_;
                fVar270 = (float)local_ac0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar180,auVar180);
                fVar278 = auVar98._0_4_;
              }
              auVar358 = ZEXT1664(auVar138);
              auVar180 = vpermilps_avx(local_8e0._0_16_,0xff);
              auVar15 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar215 = fVar215 * fVar214 - auVar15._0_4_;
              auVar227._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar199._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar199._12_4_ ^ 0x80000000;
              auVar256._0_4_ = -fVar215;
              auVar256._4_4_ = 0x80000000;
              auVar256._8_4_ = 0x80000000;
              auVar256._12_4_ = 0x80000000;
              auVar98 = vinsertps_avx(ZEXT416((uint)(fVar272 * fVar214)),auVar227,0x10);
              auVar199 = vmovsldup_avx(ZEXT416((uint)(local_940._0_4_ * fVar272 * fVar214 -
                                                     auVar199._0_4_ * fVar215)));
              auVar98 = vdivps_avx(auVar98,auVar199);
              auVar93 = ZEXT416((uint)(fVar278 - auVar180._0_4_));
              auVar180 = vinsertps_avx(auVar142,auVar93,0x10);
              auVar201._0_4_ = auVar180._0_4_ * auVar98._0_4_;
              auVar201._4_4_ = auVar180._4_4_ * auVar98._4_4_;
              auVar201._8_4_ = auVar180._8_4_ * auVar98._8_4_;
              auVar201._12_4_ = auVar180._12_4_ * auVar98._12_4_;
              auVar98 = vinsertps_avx(auVar256,local_940._0_16_,0x1c);
              auVar98 = vdivps_avx(auVar98,auVar199);
              auVar181._0_4_ = auVar180._0_4_ * auVar98._0_4_;
              auVar181._4_4_ = auVar180._4_4_ * auVar98._4_4_;
              auVar181._8_4_ = auVar180._8_4_ * auVar98._8_4_;
              auVar181._12_4_ = auVar180._12_4_ * auVar98._12_4_;
              auVar98 = vhaddps_avx(auVar201,auVar201);
              auVar180 = vhaddps_avx(auVar181,auVar181);
              fVar194 = fVar194 - auVar98._0_4_;
              local_bc0 = local_bc0 - auVar180._0_4_;
              auVar238 = ZEXT464((uint)local_bc0);
              auVar228._8_4_ = 0x7fffffff;
              auVar228._0_8_ = 0x7fffffff7fffffff;
              auVar228._12_4_ = 0x7fffffff;
              auVar212 = ZEXT1664(auVar228);
              auVar142 = vandps_avx(auVar142,auVar228);
              if (fVar213 <= auVar142._0_4_) {
LAB_00f1ea5a:
                bVar63 = false;
              }
              else {
                auVar142 = vandps_avx(auVar93,auVar228);
                if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar270 + fVar213 <= auVar142._0_4_)
                goto LAB_00f1ea5a;
                local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                auVar238 = ZEXT464((uint)local_bc0);
                bVar63 = true;
                if ((((fVar250 <= local_bc0) &&
                     (fVar213 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar213)) &&
                    (0.0 <= fVar194)) && (fVar194 <= 1.0)) {
                  auVar142 = vrsqrtss_avx(auVar138,auVar138);
                  fVar270 = auVar142._0_4_;
                  auVar84 = (undefined1  [8])(context->scene->geometries).items[uVar81].ptr;
                  if ((((Geometry *)auVar84)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar142 = ZEXT416((uint)(fVar270 * 1.5 +
                                             fVar268 * -0.5 * fVar270 * fVar270 * fVar270));
                    auVar142 = vshufps_avx(auVar142,auVar142,0);
                    auVar143._0_4_ = auVar142._0_4_ * (float)local_ae0._0_4_;
                    auVar143._4_4_ = auVar142._4_4_ * (float)local_ae0._4_4_;
                    auVar143._8_4_ = auVar142._8_4_ * fStack_ad8;
                    auVar143._12_4_ = auVar142._12_4_ * fStack_ad4;
                    auVar100._0_4_ = local_b00._0_4_ + auVar15._0_4_ * auVar143._0_4_;
                    auVar100._4_4_ = local_b00._4_4_ + auVar15._4_4_ * auVar143._4_4_;
                    auVar100._8_4_ = local_b00._8_4_ + auVar15._8_4_ * auVar143._8_4_;
                    auVar100._12_4_ = local_b00._12_4_ + auVar15._12_4_ * auVar143._12_4_;
                    auVar142 = vshufps_avx(auVar143,auVar143,0xc9);
                    auVar98 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar144._0_4_ = auVar98._0_4_ * auVar143._0_4_;
                    auVar144._4_4_ = auVar98._4_4_ * auVar143._4_4_;
                    auVar144._8_4_ = auVar98._8_4_ * auVar143._8_4_;
                    auVar144._12_4_ = auVar98._12_4_ * auVar143._12_4_;
                    auVar182._0_4_ = local_b00._0_4_ * auVar142._0_4_;
                    auVar182._4_4_ = local_b00._4_4_ * auVar142._4_4_;
                    auVar182._8_4_ = local_b00._8_4_ * auVar142._8_4_;
                    auVar182._12_4_ = local_b00._12_4_ * auVar142._12_4_;
                    auVar180 = vsubps_avx(auVar182,auVar144);
                    auVar142 = vshufps_avx(auVar180,auVar180,0xc9);
                    auVar98 = vshufps_avx(auVar100,auVar100,0xc9);
                    auVar183._0_4_ = auVar98._0_4_ * auVar142._0_4_;
                    auVar183._4_4_ = auVar98._4_4_ * auVar142._4_4_;
                    auVar183._8_4_ = auVar98._8_4_ * auVar142._8_4_;
                    auVar183._12_4_ = auVar98._12_4_ * auVar142._12_4_;
                    auVar142 = vshufps_avx(auVar180,auVar180,0xd2);
                    auVar101._0_4_ = auVar100._0_4_ * auVar142._0_4_;
                    auVar101._4_4_ = auVar100._4_4_ * auVar142._4_4_;
                    auVar101._8_4_ = auVar100._8_4_ * auVar142._8_4_;
                    auVar101._12_4_ = auVar100._12_4_ * auVar142._12_4_;
                    auVar142 = vsubps_avx(auVar183,auVar101);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (((Geometry *)auVar84)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      uVar2 = vextractps_avx(auVar142,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar142,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(int *)(ray + k * 4 + 0xe0) = auVar142._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar194;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar81;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      auVar98 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
                      local_700 = (RTCHitN  [16])vshufps_avx(auVar142,auVar142,0x55);
                      auVar180 = vshufps_avx(auVar142,auVar142,0xaa);
                      local_6e0 = vshufps_avx(auVar142,auVar142,0);
                      auStack_6f0 = auVar180;
                      local_6d0 = auVar98;
                      local_6c0 = ZEXT816(0) << 0x20;
                      local_6b0 = local_720._0_8_;
                      uStack_6a8 = local_720._8_8_;
                      local_6a0 = local_710._0_8_;
                      uStack_698 = local_710._8_8_;
                      uVar8 = context->user->instID[0];
                      _local_690 = CONCAT44(uVar8,uVar8);
                      _uStack_688 = CONCAT44(uVar8,uVar8);
                      uVar8 = context->user->instPrimID[0];
                      _uStack_680 = CONCAT44(uVar8,uVar8);
                      _uStack_678 = CONCAT44(uVar8,uVar8);
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      local_b20 = *local_9f0;
                      uStack_b18 = local_9f0[1];
                      local_a50.valid = (int *)&local_b20;
                      local_a50.geometryUserPtr = ((Geometry *)auVar84)->userPtr;
                      local_a50.context = context->user;
                      local_a50.hit = local_700;
                      local_a50.N = 4;
                      local_a50.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar84)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_ae0 = auVar84;
                        auVar358 = ZEXT1664(auVar138);
                        (*((Geometry *)auVar84)->intersectionFilterN)(&local_a50);
                        auVar212._8_56_ = extraout_var;
                        auVar212._0_8_ = extraout_XMM1_Qa;
                        auVar98 = auVar212._0_16_;
                        auVar84 = local_ae0;
                      }
                      auVar75._8_8_ = uStack_b18;
                      auVar75._0_8_ = local_b20;
                      if (auVar75 == (undefined1  [16])0x0) {
                        auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar142 = vpcmpeqd_avx(auVar98,auVar98);
                        auVar138 = auVar138 ^ auVar142;
                        auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var7 = context->args->filter;
                        auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar142 = vpcmpeqd_avx(auVar180,auVar180);
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((((Geometry *)auVar84)->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          (*p_Var7)(&local_a50);
                          auVar142 = vpcmpeqd_avx(auVar142,auVar142);
                          auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar76._8_8_ = uStack_b18;
                        auVar76._0_8_ = local_b20;
                        auVar98 = vpcmpeqd_avx(auVar76,_DAT_01feba10);
                        auVar138 = auVar98 ^ auVar142;
                        if (auVar76 != (undefined1  [16])0x0) {
                          auVar98 = auVar98 ^ auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])local_a50.hit);
                          *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x10));
                          *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x20));
                          *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x30));
                          *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x40));
                          *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x50));
                          *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x60));
                          *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x70));
                          *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x80));
                          *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar142;
                        }
                      }
                      auVar238 = ZEXT464((uint)local_bc0);
                      auVar145._8_8_ = 0x100000001;
                      auVar145._0_8_ = 0x100000001;
                      if ((auVar145 & auVar138) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar213;
                      }
                    }
                  }
                }
              }
              auVar107 = local_5e0;
              bVar88 = lVar83 != 0;
              lVar83 = lVar83 + -1;
            } while ((!bVar63) && (bVar88));
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar115._4_4_ = uVar2;
            auVar115._0_4_ = uVar2;
            auVar115._8_4_ = uVar2;
            auVar115._12_4_ = uVar2;
            auVar115._16_4_ = uVar2;
            auVar115._20_4_ = uVar2;
            auVar115._24_4_ = uVar2;
            auVar115._28_4_ = uVar2;
            auVar108 = vcmpps_avx(_local_840,auVar115,2);
            local_5e0 = vandps_avx(auVar108,local_5e0);
            auVar107 = auVar107 & auVar108;
            uVar86 = local_620._0_8_;
          } while ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar107 >> 0x7f,0) != '\0') ||
                     (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar107 >> 0xbf,0) != '\0') ||
                   (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar107[0x1f] < '\0');
        }
        auVar116._0_4_ =
             (float)local_8a0._0_4_ * (float)local_7c0._0_4_ +
             (float)local_860._0_4_ * (float)local_7e0._0_4_ +
             (float)local_640._0_4_ * (float)local_800._0_4_;
        auVar116._4_4_ =
             (float)local_8a0._4_4_ * (float)local_7c0._4_4_ +
             (float)local_860._4_4_ * (float)local_7e0._4_4_ +
             (float)local_640._4_4_ * (float)local_800._4_4_;
        auVar116._8_4_ = fStack_898 * fStack_7b8 + fStack_858 * fStack_7d8 + fStack_638 * fStack_7f8
        ;
        auVar116._12_4_ =
             fStack_894 * fStack_7b4 + fStack_854 * fStack_7d4 + fStack_634 * fStack_7f4;
        auVar116._16_4_ =
             fStack_890 * fStack_7b0 + fStack_850 * fStack_7d0 + fStack_630 * fStack_7f0;
        auVar116._20_4_ =
             fStack_88c * fStack_7ac + fStack_84c * fStack_7cc + fStack_62c * fStack_7ec;
        auVar116._24_4_ =
             fStack_888 * fStack_7a8 + fStack_848 * fStack_7c8 + fStack_628 * fStack_7e8;
        auVar116._28_4_ = fStack_884 + fStack_844 + fStack_624;
        auVar162._8_4_ = 0x7fffffff;
        auVar162._0_8_ = 0x7fffffff7fffffff;
        auVar162._12_4_ = 0x7fffffff;
        auVar162._16_4_ = 0x7fffffff;
        auVar162._20_4_ = 0x7fffffff;
        auVar162._24_4_ = 0x7fffffff;
        auVar162._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar116,auVar162);
        auVar163._8_4_ = 0x3e99999a;
        auVar163._0_8_ = 0x3e99999a3e99999a;
        auVar163._12_4_ = 0x3e99999a;
        auVar163._16_4_ = 0x3e99999a;
        auVar163._20_4_ = 0x3e99999a;
        auVar163._24_4_ = 0x3e99999a;
        auVar163._28_4_ = 0x3e99999a;
        auVar107 = vcmpps_avx(auVar107,auVar163,1);
        auVar108 = vorps_avx(auVar107,local_5c0);
        auVar164._0_4_ = local_820._0_4_ + (float)local_900._0_4_;
        auVar164._4_4_ = local_820._4_4_ + (float)local_900._4_4_;
        auVar164._8_4_ = local_820._8_4_ + fStack_8f8;
        auVar164._12_4_ = local_820._12_4_ + fStack_8f4;
        auVar164._16_4_ = local_820._16_4_ + fStack_8f0;
        auVar164._20_4_ = local_820._20_4_ + fStack_8ec;
        auVar164._24_4_ = local_820._24_4_ + fStack_8e8;
        auVar164._28_4_ = local_820._28_4_ + fStack_8e4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar189._4_4_ = uVar2;
        auVar189._0_4_ = uVar2;
        auVar189._8_4_ = uVar2;
        auVar189._12_4_ = uVar2;
        auVar189._16_4_ = uVar2;
        auVar189._20_4_ = uVar2;
        auVar189._24_4_ = uVar2;
        auVar189._28_4_ = uVar2;
        auVar107 = vcmpps_avx(auVar164,auVar189,2);
        _local_840 = vandps_avx(auVar107,local_580);
        auVar165._8_4_ = 3;
        auVar165._0_8_ = 0x300000003;
        auVar165._12_4_ = 3;
        auVar165._16_4_ = 3;
        auVar165._20_4_ = 3;
        auVar165._24_4_ = 3;
        auVar165._28_4_ = 3;
        auVar190._8_4_ = 2;
        auVar190._0_8_ = 0x200000002;
        auVar190._12_4_ = 2;
        auVar190._16_4_ = 2;
        auVar190._20_4_ = 2;
        auVar190._24_4_ = 2;
        auVar190._28_4_ = 2;
        auVar107 = vblendvps_avx(auVar190,auVar165,auVar108);
        auVar138 = vpcmpgtd_avx(auVar107._16_16_,local_660._0_16_);
        auVar142 = vpshufd_avx(local_5a0._0_16_,0);
        auVar142 = vpcmpgtd_avx(auVar107._0_16_,auVar142);
        auVar166._16_16_ = auVar138;
        auVar166._0_16_ = auVar142;
        _local_8a0 = vblendps_avx(ZEXT1632(auVar142),auVar166,0xf0);
        local_600 = vandnps_avx(_local_8a0,_local_840);
        auVar107 = _local_840 & ~_local_8a0;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          _local_9e0 = _local_460;
          local_820._4_4_ = (float)local_460._4_4_ + (float)local_900._4_4_;
          local_820._0_4_ = (float)local_460._0_4_ + (float)local_900._0_4_;
          fStack_818 = fStack_458 + fStack_8f8;
          fStack_814 = fStack_454 + fStack_8f4;
          fStack_810 = fStack_450 + fStack_8f0;
          fStack_80c = fStack_44c + fStack_8ec;
          fStack_808 = fStack_448 + fStack_8e8;
          fStack_804 = fStack_444 + fStack_8e4;
          do {
            auVar229 = auVar212._0_16_;
            auVar167._8_4_ = 0x7f800000;
            auVar167._0_8_ = 0x7f8000007f800000;
            auVar167._12_4_ = 0x7f800000;
            auVar167._16_4_ = 0x7f800000;
            auVar167._20_4_ = 0x7f800000;
            auVar167._24_4_ = 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar167,_local_9e0,local_600);
            auVar108 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar108 = vminps_avx(auVar107,auVar108);
            auVar17 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar17);
            auVar17 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar17);
            auVar108 = vcmpps_avx(auVar107,auVar108,0);
            auVar17 = local_600 & auVar108;
            auVar107 = local_600;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar108,local_600);
            }
            uVar85 = vmovmskps_avx(auVar107);
            uVar8 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar86 = (ulong)uVar8;
            *(undefined4 *)(local_600 + uVar86 * 4) = 0;
            fVar194 = local_520[uVar86];
            uVar8 = *(uint *)(local_440 + uVar86 * 4);
            fVar268 = local_b08;
            if ((float)local_920._0_4_ < 0.0) {
              fVar268 = sqrtf((float)local_920._0_4_);
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
            }
            auVar238 = ZEXT464(uVar8);
            auVar142 = vminps_avx(_local_a60,_local_a80);
            auVar138 = vmaxps_avx(_local_a60,_local_a80);
            auVar98 = vminps_avx(_local_a70,_local_a90);
            auVar180 = vminps_avx(auVar142,auVar98);
            auVar142 = vmaxps_avx(_local_a70,_local_a90);
            auVar98 = vmaxps_avx(auVar138,auVar142);
            auVar138 = vandps_avx(auVar180,auVar229);
            auVar142 = vandps_avx(auVar98,auVar229);
            auVar138 = vmaxps_avx(auVar138,auVar142);
            auVar142 = vmovshdup_avx(auVar138);
            auVar142 = vmaxss_avx(auVar142,auVar138);
            auVar138 = vshufpd_avx(auVar138,auVar138,1);
            auVar138 = vmaxss_avx(auVar138,auVar142);
            local_a20._0_4_ = auVar138._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar268 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar98,auVar98,0xff);
            lVar83 = 4;
            do {
              local_b00._0_4_ = 1.0 - fVar194;
              auVar138 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
              fVar268 = auVar138._0_4_;
              fVar213 = auVar138._4_4_;
              fVar270 = auVar138._8_4_;
              fVar214 = auVar138._12_4_;
              auVar138 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_),0
                                    );
              fVar272 = auVar138._0_4_;
              fVar215 = auVar138._4_4_;
              fVar278 = auVar138._8_4_;
              fVar290 = auVar138._12_4_;
              fVar293 = (float)local_a70._0_4_ * fVar268 + (float)local_a80._0_4_ * fVar272;
              fVar296 = (float)local_a70._4_4_ * fVar213 + (float)local_a80._4_4_ * fVar215;
              fVar216 = fStack_a68 * fVar270 + fStack_a78 * fVar278;
              fVar217 = fStack_a64 * fVar214 + fStack_a74 * fVar290;
              auVar257._0_4_ =
                   fVar272 * ((float)local_a80._0_4_ * fVar268 + fVar272 * (float)local_a60._0_4_) +
                   fVar268 * fVar293;
              auVar257._4_4_ =
                   fVar215 * ((float)local_a80._4_4_ * fVar213 + fVar215 * (float)local_a60._4_4_) +
                   fVar213 * fVar296;
              auVar257._8_4_ =
                   fVar278 * (fStack_a78 * fVar270 + fVar278 * fStack_a58) + fVar270 * fVar216;
              auVar257._12_4_ =
                   fVar290 * (fStack_a74 * fVar214 + fVar290 * fStack_a54) + fVar214 * fVar217;
              auVar202._0_4_ =
                   fVar272 * fVar293 +
                   fVar268 * (fVar268 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar272);
              auVar202._4_4_ =
                   fVar215 * fVar296 +
                   fVar213 * (fVar213 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar215);
              auVar202._8_4_ =
                   fVar278 * fVar216 + fVar270 * (fVar270 * fStack_a88 + fStack_a68 * fVar278);
              auVar202._12_4_ =
                   fVar290 * fVar217 + fVar214 * (fVar214 * fStack_a84 + fStack_a64 * fVar290);
              auVar138 = vshufps_avx(auVar238._0_16_,auVar238._0_16_,0);
              auVar146._0_4_ = auVar138._0_4_ * (float)local_910._0_4_ + 0.0;
              auVar146._4_4_ = auVar138._4_4_ * (float)local_910._4_4_ + 0.0;
              auVar146._8_4_ = auVar138._8_4_ * fStack_908 + 0.0;
              auVar146._12_4_ = auVar138._12_4_ * fStack_904 + 0.0;
              auVar102._0_4_ = fVar272 * auVar257._0_4_ + fVar268 * auVar202._0_4_;
              auVar102._4_4_ = fVar215 * auVar257._4_4_ + fVar213 * auVar202._4_4_;
              auVar102._8_4_ = fVar278 * auVar257._8_4_ + fVar270 * auVar202._8_4_;
              auVar102._12_4_ = fVar290 * auVar257._12_4_ + fVar214 * auVar202._12_4_;
              local_8e0._0_16_ = auVar102;
              auVar138 = vsubps_avx(auVar146,auVar102);
              _local_ae0 = auVar138;
              auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
              fVar268 = auVar138._0_4_;
              local_bc0 = auVar238._0_4_;
              if (fVar268 < 0.0) {
                local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                local_ac0._0_16_ = auVar257;
                local_960._0_16_ = auVar202;
                fVar213 = sqrtf(fVar268);
                auVar202 = local_960._0_16_;
                auVar257 = local_ac0._0_16_;
              }
              else {
                auVar142 = vsqrtss_avx(auVar138,auVar138);
                fVar213 = auVar142._0_4_;
              }
              auVar142 = vsubps_avx(auVar202,auVar257);
              auVar283._0_4_ = auVar142._0_4_ * 3.0;
              auVar283._4_4_ = auVar142._4_4_ * 3.0;
              auVar283._8_4_ = auVar142._8_4_ * 3.0;
              auVar283._12_4_ = auVar142._12_4_ * 3.0;
              auVar142 = vshufps_avx(ZEXT416((uint)(fVar194 * 6.0)),ZEXT416((uint)(fVar194 * 6.0)),0
                                    );
              auVar98 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar194 + fVar194)) * 6.0));
              auVar180 = vshufps_avx(auVar98,auVar98,0);
              auVar98 = ZEXT416((uint)((fVar194 - ((float)local_b00._0_4_ + (float)local_b00._0_4_))
                                      * 6.0));
              auVar199 = vshufps_avx(auVar98,auVar98,0);
              auVar15 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                    ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
              auVar98 = vdpps_avx(auVar283,auVar283,0x7f);
              auVar147._0_4_ =
                   auVar15._0_4_ * (float)local_a60._0_4_ +
                   auVar199._0_4_ * (float)local_a80._0_4_ +
                   auVar142._0_4_ * (float)local_a90._0_4_ + auVar180._0_4_ * (float)local_a70._0_4_
              ;
              auVar147._4_4_ =
                   auVar15._4_4_ * (float)local_a60._4_4_ +
                   auVar199._4_4_ * (float)local_a80._4_4_ +
                   auVar142._4_4_ * (float)local_a90._4_4_ + auVar180._4_4_ * (float)local_a70._4_4_
              ;
              auVar147._8_4_ =
                   auVar15._8_4_ * fStack_a58 +
                   auVar199._8_4_ * fStack_a78 +
                   auVar142._8_4_ * fStack_a88 + auVar180._8_4_ * fStack_a68;
              auVar147._12_4_ =
                   auVar15._12_4_ * fStack_a54 +
                   auVar199._12_4_ * fStack_a74 +
                   auVar142._12_4_ * fStack_a84 + auVar180._12_4_ * fStack_a64;
              auVar142 = vblendps_avx(auVar98,_DAT_01feba10,0xe);
              auVar180 = vrsqrtss_avx(auVar142,auVar142);
              fVar214 = auVar180._0_4_;
              fVar270 = auVar98._0_4_;
              auVar180 = vdpps_avx(auVar283,auVar147,0x7f);
              auVar199 = vshufps_avx(auVar98,auVar98,0);
              auVar148._0_4_ = auVar147._0_4_ * auVar199._0_4_;
              auVar148._4_4_ = auVar147._4_4_ * auVar199._4_4_;
              auVar148._8_4_ = auVar147._8_4_ * auVar199._8_4_;
              auVar148._12_4_ = auVar147._12_4_ * auVar199._12_4_;
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              auVar230._0_4_ = auVar283._0_4_ * auVar180._0_4_;
              auVar230._4_4_ = auVar283._4_4_ * auVar180._4_4_;
              auVar230._8_4_ = auVar283._8_4_ * auVar180._8_4_;
              auVar230._12_4_ = auVar283._12_4_ * auVar180._12_4_;
              auVar15 = vsubps_avx(auVar148,auVar230);
              auVar180 = vrcpss_avx(auVar142,auVar142);
              auVar142 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                    ZEXT416((uint)(local_bc0 * (float)local_940._0_4_)));
              auVar180 = ZEXT416((uint)(auVar180._0_4_ * (2.0 - fVar270 * auVar180._0_4_)));
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              uVar86 = CONCAT44(auVar283._4_4_,auVar283._0_4_);
              auVar258._0_8_ = uVar86 ^ 0x8000000080000000;
              auVar258._8_4_ = -auVar283._8_4_;
              auVar258._12_4_ = -auVar283._12_4_;
              auVar199 = ZEXT416((uint)(fVar214 * 1.5 + fVar270 * -0.5 * fVar214 * fVar214 * fVar214
                                       ));
              auVar199 = vshufps_avx(auVar199,auVar199,0);
              auVar203._0_4_ = auVar199._0_4_ * auVar15._0_4_ * auVar180._0_4_;
              auVar203._4_4_ = auVar199._4_4_ * auVar15._4_4_ * auVar180._4_4_;
              auVar203._8_4_ = auVar199._8_4_ * auVar15._8_4_ * auVar180._8_4_;
              auVar203._12_4_ = auVar199._12_4_ * auVar15._12_4_ * auVar180._12_4_;
              auVar328._0_4_ = auVar283._0_4_ * auVar199._0_4_;
              auVar328._4_4_ = auVar283._4_4_ * auVar199._4_4_;
              auVar328._8_4_ = auVar283._8_4_ * auVar199._8_4_;
              auVar328._12_4_ = auVar283._12_4_ * auVar199._12_4_;
              local_b00._0_16_ = auVar283;
              local_ac0._0_4_ = auVar142._0_4_;
              if (fVar270 < 0.0) {
                local_960._0_4_ = fVar213;
                local_980._0_16_ = auVar258;
                local_9a0._0_16_ = auVar328;
                local_9c0._0_16_ = auVar203;
                fVar214 = sqrtf(fVar270);
                auVar203 = local_9c0._0_16_;
                auVar258 = local_980._0_16_;
                auVar328 = local_9a0._0_16_;
                fVar270 = (float)local_ac0._0_4_;
                fVar213 = (float)local_960._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                fVar214 = auVar98._0_4_;
                fVar270 = auVar142._0_4_;
              }
              auVar142 = vdpps_avx(_local_ae0,auVar328,0x7f);
              fVar213 = ((float)local_a20._0_4_ / fVar214) * (fVar213 + 1.0) +
                        fVar270 + fVar213 * (float)local_a20._0_4_;
              auVar98 = vdpps_avx(auVar258,auVar328,0x7f);
              auVar180 = vdpps_avx(_local_ae0,auVar203,0x7f);
              auVar199 = vdpps_avx(_local_910,auVar328,0x7f);
              auVar15 = vdpps_avx(_local_ae0,auVar258,0x7f);
              fVar214 = auVar98._0_4_ + auVar180._0_4_;
              fVar272 = auVar142._0_4_;
              auVar103._0_4_ = fVar272 * fVar272;
              auVar103._4_4_ = auVar142._4_4_ * auVar142._4_4_;
              auVar103._8_4_ = auVar142._8_4_ * auVar142._8_4_;
              auVar103._12_4_ = auVar142._12_4_ * auVar142._12_4_;
              auVar180 = vsubps_avx(auVar138,auVar103);
              auVar98 = vdpps_avx(_local_ae0,_local_910,0x7f);
              fVar215 = auVar15._0_4_ - fVar272 * fVar214;
              fVar278 = auVar98._0_4_ - fVar272 * auVar199._0_4_;
              auVar98 = vrsqrtss_avx(auVar180,auVar180);
              fVar290 = auVar180._0_4_;
              fVar272 = auVar98._0_4_;
              fVar272 = fVar272 * 1.5 + fVar290 * -0.5 * fVar272 * fVar272 * fVar272;
              if (fVar290 < 0.0) {
                local_960._0_16_ = auVar142;
                local_980._0_4_ = fVar213;
                local_9a0._0_16_ = ZEXT416((uint)fVar214);
                local_9c0._0_16_ = auVar199;
                local_740._0_4_ = fVar215;
                local_760._0_4_ = fVar278;
                local_780._0_4_ = fVar272;
                fVar290 = sqrtf(fVar290);
                fVar213 = (float)local_980._0_4_;
                fVar272 = (float)local_780._0_4_;
                fVar215 = (float)local_740._0_4_;
                fVar278 = (float)local_760._0_4_;
                auVar199 = local_9c0._0_16_;
                auVar142 = local_960._0_16_;
                auVar98 = local_9a0._0_16_;
                fVar270 = (float)local_ac0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar180,auVar180);
                fVar290 = auVar98._0_4_;
                auVar98 = ZEXT416((uint)fVar214);
              }
              auVar358 = ZEXT1664(local_b00._0_16_);
              auVar94 = vpermilps_avx(local_8e0._0_16_,0xff);
              auVar93 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar214 = fVar215 * fVar272 - auVar93._0_4_;
              auVar231._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = auVar199._8_4_ ^ 0x80000000;
              auVar231._12_4_ = auVar199._12_4_ ^ 0x80000000;
              auVar259._0_4_ = -fVar214;
              auVar259._4_4_ = 0x80000000;
              auVar259._8_4_ = 0x80000000;
              auVar259._12_4_ = 0x80000000;
              auVar180 = vinsertps_avx(ZEXT416((uint)(fVar278 * fVar272)),auVar231,0x10);
              auVar15 = vmovsldup_avx(ZEXT416((uint)(auVar98._0_4_ * fVar278 * fVar272 -
                                                    auVar199._0_4_ * fVar214)));
              auVar180 = vdivps_avx(auVar180,auVar15);
              auVar94 = ZEXT416((uint)(fVar290 - auVar94._0_4_));
              auVar199 = vinsertps_avx(auVar142,auVar94,0x10);
              auVar204._0_4_ = auVar199._0_4_ * auVar180._0_4_;
              auVar204._4_4_ = auVar199._4_4_ * auVar180._4_4_;
              auVar204._8_4_ = auVar199._8_4_ * auVar180._8_4_;
              auVar204._12_4_ = auVar199._12_4_ * auVar180._12_4_;
              auVar98 = vinsertps_avx(auVar259,auVar98,0x1c);
              auVar98 = vdivps_avx(auVar98,auVar15);
              auVar184._0_4_ = auVar199._0_4_ * auVar98._0_4_;
              auVar184._4_4_ = auVar199._4_4_ * auVar98._4_4_;
              auVar184._8_4_ = auVar199._8_4_ * auVar98._8_4_;
              auVar184._12_4_ = auVar199._12_4_ * auVar98._12_4_;
              auVar98 = vhaddps_avx(auVar204,auVar204);
              auVar180 = vhaddps_avx(auVar184,auVar184);
              fVar194 = fVar194 - auVar98._0_4_;
              local_bc0 = local_bc0 - auVar180._0_4_;
              auVar238 = ZEXT464((uint)local_bc0);
              auVar232._8_4_ = 0x7fffffff;
              auVar232._0_8_ = 0x7fffffff7fffffff;
              auVar232._12_4_ = 0x7fffffff;
              auVar212 = ZEXT1664(auVar232);
              auVar142 = vandps_avx(auVar142,auVar232);
              if (fVar213 <= auVar142._0_4_) {
LAB_00f1f637:
                bVar63 = false;
              }
              else {
                auVar142 = vandps_avx(auVar94,auVar232);
                if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar270 + fVar213 <= auVar142._0_4_)
                goto LAB_00f1f637;
                local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                auVar238 = ZEXT464((uint)local_bc0);
                bVar63 = true;
                if ((((fVar250 <= local_bc0) &&
                     (fVar213 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar213)) &&
                    (0.0 <= fVar194)) && (fVar194 <= 1.0)) {
                  auVar138 = vrsqrtss_avx(auVar138,auVar138);
                  fVar270 = auVar138._0_4_;
                  auVar84 = (undefined1  [8])(context->scene->geometries).items[uVar81].ptr;
                  if ((((Geometry *)auVar84)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar138 = ZEXT416((uint)(fVar270 * 1.5 +
                                             fVar268 * -0.5 * fVar270 * fVar270 * fVar270));
                    auVar138 = vshufps_avx(auVar138,auVar138,0);
                    auVar149._0_4_ = auVar138._0_4_ * (float)local_ae0._0_4_;
                    auVar149._4_4_ = auVar138._4_4_ * (float)local_ae0._4_4_;
                    auVar149._8_4_ = auVar138._8_4_ * fStack_ad8;
                    auVar149._12_4_ = auVar138._12_4_ * fStack_ad4;
                    auVar104._0_4_ = local_b00._0_4_ + auVar93._0_4_ * auVar149._0_4_;
                    auVar104._4_4_ = local_b00._4_4_ + auVar93._4_4_ * auVar149._4_4_;
                    auVar104._8_4_ = local_b00._8_4_ + auVar93._8_4_ * auVar149._8_4_;
                    auVar104._12_4_ = local_b00._12_4_ + auVar93._12_4_ * auVar149._12_4_;
                    auVar138 = vshufps_avx(auVar149,auVar149,0xc9);
                    auVar142 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar150._0_4_ = auVar142._0_4_ * auVar149._0_4_;
                    auVar150._4_4_ = auVar142._4_4_ * auVar149._4_4_;
                    auVar150._8_4_ = auVar142._8_4_ * auVar149._8_4_;
                    auVar150._12_4_ = auVar142._12_4_ * auVar149._12_4_;
                    auVar185._0_4_ = local_b00._0_4_ * auVar138._0_4_;
                    auVar185._4_4_ = local_b00._4_4_ * auVar138._4_4_;
                    auVar185._8_4_ = local_b00._8_4_ * auVar138._8_4_;
                    auVar185._12_4_ = local_b00._12_4_ * auVar138._12_4_;
                    auVar98 = vsubps_avx(auVar185,auVar150);
                    auVar138 = vshufps_avx(auVar98,auVar98,0xc9);
                    auVar142 = vshufps_avx(auVar104,auVar104,0xc9);
                    auVar186._0_4_ = auVar142._0_4_ * auVar138._0_4_;
                    auVar186._4_4_ = auVar142._4_4_ * auVar138._4_4_;
                    auVar186._8_4_ = auVar142._8_4_ * auVar138._8_4_;
                    auVar186._12_4_ = auVar142._12_4_ * auVar138._12_4_;
                    auVar138 = vshufps_avx(auVar98,auVar98,0xd2);
                    auVar105._0_4_ = auVar104._0_4_ * auVar138._0_4_;
                    auVar105._4_4_ = auVar104._4_4_ * auVar138._4_4_;
                    auVar105._8_4_ = auVar104._8_4_ * auVar138._8_4_;
                    auVar105._12_4_ = auVar104._12_4_ * auVar138._12_4_;
                    auVar138 = vsubps_avx(auVar186,auVar105);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (((Geometry *)auVar84)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      uVar2 = vextractps_avx(auVar138,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar138,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(int *)(ray + k * 4 + 0xe0) = auVar138._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar194;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar81;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      auVar142 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
                      local_700 = (RTCHitN  [16])vshufps_avx(auVar138,auVar138,0x55);
                      auVar98 = vshufps_avx(auVar138,auVar138,0xaa);
                      local_6e0 = vshufps_avx(auVar138,auVar138,0);
                      auStack_6f0 = auVar98;
                      local_6d0 = auVar142;
                      local_6c0 = ZEXT816(0) << 0x20;
                      local_6b0 = local_720._0_8_;
                      uStack_6a8 = local_720._8_8_;
                      local_6a0 = local_710._0_8_;
                      uStack_698 = local_710._8_8_;
                      uVar8 = context->user->instID[0];
                      _local_690 = CONCAT44(uVar8,uVar8);
                      _uStack_688 = CONCAT44(uVar8,uVar8);
                      uVar8 = context->user->instPrimID[0];
                      _uStack_680 = CONCAT44(uVar8,uVar8);
                      _uStack_678 = CONCAT44(uVar8,uVar8);
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      local_b20 = *local_9f0;
                      uStack_b18 = local_9f0[1];
                      local_a50.valid = (int *)&local_b20;
                      local_a50.geometryUserPtr = ((Geometry *)auVar84)->userPtr;
                      local_a50.context = context->user;
                      local_a50.hit = local_700;
                      local_a50.N = 4;
                      local_a50.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar84)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_ae0 = auVar84;
                        auVar358 = ZEXT1664(local_b00._0_16_);
                        (*((Geometry *)auVar84)->intersectionFilterN)(&local_a50);
                        auVar238._8_56_ = extraout_var_00;
                        auVar238._0_8_ = extraout_XMM1_Qa_00;
                        auVar142 = auVar238._0_16_;
                        auVar84 = local_ae0;
                      }
                      auVar77._8_8_ = uStack_b18;
                      auVar77._0_8_ = local_b20;
                      if (auVar77 == (undefined1  [16])0x0) {
                        auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar142 = vpcmpeqd_avx(auVar142,auVar142);
                        auVar138 = auVar138 ^ auVar142;
                        auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var7 = context->args->filter;
                        auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar142 = vpcmpeqd_avx(auVar98,auVar98);
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((((Geometry *)auVar84)->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          (*p_Var7)(&local_a50);
                          auVar142 = vpcmpeqd_avx(auVar142,auVar142);
                          auVar212 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar78._8_8_ = uStack_b18;
                        auVar78._0_8_ = local_b20;
                        auVar98 = vpcmpeqd_avx(auVar78,_DAT_01feba10);
                        auVar138 = auVar98 ^ auVar142;
                        if (auVar78 != (undefined1  [16])0x0) {
                          auVar98 = auVar98 ^ auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])local_a50.hit);
                          *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x10));
                          *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x20));
                          *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x30));
                          *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x40));
                          *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x50));
                          *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x60));
                          *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x70));
                          *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar142;
                          auVar142 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                             (local_a50.hit + 0x80));
                          *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar142;
                        }
                      }
                      auVar238 = ZEXT464((uint)local_bc0);
                      auVar151._8_8_ = 0x100000001;
                      auVar151._0_8_ = 0x100000001;
                      if ((auVar151 & auVar138) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar213;
                      }
                    }
                  }
                }
              }
              auVar107 = local_600;
              bVar88 = lVar83 != 0;
              lVar83 = lVar83 + -1;
            } while ((!bVar63) && (bVar88));
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar117._4_4_ = uVar2;
            auVar117._0_4_ = uVar2;
            auVar117._8_4_ = uVar2;
            auVar117._12_4_ = uVar2;
            auVar117._16_4_ = uVar2;
            auVar117._20_4_ = uVar2;
            auVar117._24_4_ = uVar2;
            auVar117._28_4_ = uVar2;
            auVar108 = vcmpps_avx(_local_820,auVar117,2);
            local_600 = vandps_avx(auVar108,local_600);
            auVar107 = auVar107 & auVar108;
            uVar86 = local_620._0_8_;
          } while ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar107 >> 0x7f,0) != '\0') ||
                     (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar107 >> 0xbf,0) != '\0') ||
                   (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar107[0x1f] < '\0');
        }
        auVar107 = vandps_avx(local_560,local_540);
        auVar108 = vandps_avx(_local_8a0,_local_840);
        auVar289 = ZEXT3264(_local_900);
        auVar191._0_4_ = local_900._0_4_ + local_4a0._0_4_;
        auVar191._4_4_ = local_900._4_4_ + local_4a0._4_4_;
        auVar191._8_4_ = local_900._8_4_ + local_4a0._8_4_;
        auVar191._12_4_ = local_900._12_4_ + local_4a0._12_4_;
        auVar191._16_4_ = local_900._16_4_ + local_4a0._16_4_;
        auVar191._20_4_ = local_900._20_4_ + local_4a0._20_4_;
        auVar191._24_4_ = local_900._24_4_ + local_4a0._24_4_;
        auVar191._28_4_ = local_900._28_4_ + local_4a0._28_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar237._4_4_ = uVar2;
        auVar237._0_4_ = uVar2;
        auVar237._8_4_ = uVar2;
        auVar237._12_4_ = uVar2;
        auVar237._16_4_ = uVar2;
        auVar237._20_4_ = uVar2;
        auVar237._24_4_ = uVar2;
        auVar237._28_4_ = uVar2;
        auVar17 = vcmpps_avx(auVar191,auVar237,2);
        auVar107 = vandps_avx(auVar17,auVar107);
        auVar266._0_4_ = local_900._0_4_ + local_460._0_4_;
        auVar266._4_4_ = local_900._4_4_ + local_460._4_4_;
        auVar266._8_4_ = local_900._8_4_ + local_460._8_4_;
        auVar266._12_4_ = local_900._12_4_ + local_460._12_4_;
        auVar266._16_4_ = local_900._16_4_ + local_460._16_4_;
        auVar266._20_4_ = local_900._20_4_ + local_460._20_4_;
        auVar266._24_4_ = local_900._24_4_ + local_460._24_4_;
        auVar266._28_4_ = local_900._28_4_ + local_460._28_4_;
        auVar17 = vcmpps_avx(auVar266,auVar237,2);
        auVar108 = vandps_avx(auVar17,auVar108);
        auVar108 = vorps_avx(auVar107,auVar108);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar108;
          auVar107 = vblendvps_avx(_local_460,_local_4a0,auVar107);
          *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar107;
          auVar314 = ZEXT1664(local_a00);
          uVar3 = vmovlps_avx(local_a00);
          *(undefined8 *)(afStack_140 + uVar82 * 0x18) = uVar3;
          auStack_138[uVar82 * 0x18] = (int)uVar86 + 1;
          uVar82 = (ulong)((int)uVar82 + 1);
          auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_00f1e081;
        }
        auVar236._8_4_ = 0x3f800000;
        auVar236._0_8_ = &DAT_3f8000003f800000;
        auVar236._12_4_ = 0x3f800000;
        auVar236._16_4_ = 0x3f800000;
        auVar236._20_4_ = 0x3f800000;
        auVar236._24_4_ = 0x3f800000;
        auVar236._28_4_ = 0x3f800000;
      }
      auVar238 = ZEXT3264(auVar236);
      auVar314 = ZEXT1664(local_a00);
    }
LAB_00f1e081:
    do {
      if ((int)uVar82 == 0) {
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar106._4_4_ = uVar2;
        auVar106._0_4_ = uVar2;
        auVar106._8_4_ = uVar2;
        auVar106._12_4_ = uVar2;
        auVar138 = vcmpps_avx(local_4d0,auVar106,2);
        uVar81 = vmovmskps_avx(auVar138);
        uVar81 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_00f1cf91;
      }
      uVar87 = (ulong)((int)uVar82 - 1);
      lVar83 = uVar87 * 0x60;
      auVar107 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar113._0_4_ = auVar289._0_4_ + auVar107._0_4_;
      auVar113._4_4_ = auVar289._4_4_ + auVar107._4_4_;
      auVar113._8_4_ = auVar289._8_4_ + auVar107._8_4_;
      auVar113._12_4_ = auVar289._12_4_ + auVar107._12_4_;
      auVar113._16_4_ = auVar289._16_4_ + auVar107._16_4_;
      auVar113._20_4_ = auVar289._20_4_ + auVar107._20_4_;
      auVar113._24_4_ = auVar289._24_4_ + auVar107._24_4_;
      auVar113._28_4_ = auVar289._28_4_ + auVar107._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar211._4_4_ = uVar2;
      auVar211._0_4_ = uVar2;
      auVar211._8_4_ = uVar2;
      auVar211._12_4_ = uVar2;
      auVar211._16_4_ = uVar2;
      auVar211._20_4_ = uVar2;
      auVar211._24_4_ = uVar2;
      auVar211._28_4_ = uVar2;
      auVar17 = vcmpps_avx(auVar113,auVar211,2);
      auVar108 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar83));
      _local_700 = auVar108;
      auVar152 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar17;
      bVar69 = (auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar70 = (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar68 = (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar67 = SUB321(auVar152 >> 0x7f,0) == '\0';
      bVar66 = (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar65 = SUB321(auVar152 >> 0xbf,0) == '\0';
      bVar88 = (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar63 = -1 < auVar152[0x1f];
      if (((((((!bVar69 || !bVar70) || !bVar68) || !bVar67) || !bVar66) || !bVar65) || !bVar88) ||
          !bVar63) {
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar107 = vblendvps_avx(auVar187,auVar107,auVar108);
        auVar17 = vshufps_avx(auVar107,auVar107,0xb1);
        auVar17 = vminps_avx(auVar107,auVar17);
        auVar152 = vshufpd_avx(auVar17,auVar17,5);
        auVar152 = vminps_avx(auVar17,auVar152);
        auVar17 = vperm2f128_avx(auVar152,auVar152,1);
        auVar152 = vminps_avx(auVar152,auVar17);
        auVar107 = vcmpps_avx(auVar107,auVar152,0);
        auVar152 = auVar108 & auVar107;
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0x7f,0) != '\0') ||
              (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0xbf,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar152[0x1f] < '\0') {
          auVar108 = vandps_avx(auVar107,auVar108);
        }
        fVar194 = afStack_140[uVar87 * 0x18 + 1];
        uVar86 = (ulong)auStack_138[uVar87 * 0x18];
        uVar85 = vmovmskps_avx(auVar108);
        uVar8 = 0;
        if (uVar85 != 0) {
          for (; (uVar85 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        fVar268 = afStack_140[uVar87 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar8 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar87 = uVar82;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar83) = _local_700;
        auVar138 = vshufps_avx(ZEXT416((uint)(fVar194 - fVar268)),ZEXT416((uint)(fVar194 - fVar268))
                               ,0);
        local_4a0._4_4_ = fVar268 + auVar138._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar268 + auVar138._0_4_ * 0.0;
        fStack_498 = fVar268 + auVar138._8_4_ * 0.2857143;
        fStack_494 = fVar268 + auVar138._12_4_ * 0.42857146;
        fStack_490 = fVar268 + auVar138._0_4_ * 0.5714286;
        fStack_48c = fVar268 + auVar138._4_4_ * 0.71428573;
        fStack_488 = fVar268 + auVar138._8_4_ * 0.8571429;
        fStack_484 = fVar268 + auVar138._12_4_;
        auVar314 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar8 * 4));
      }
      uVar82 = uVar87;
      auVar212 = ZEXT3264(auVar17);
    } while (((((((bVar69 && bVar70) && bVar68) && bVar67) && bVar66) && bVar65) && bVar88) &&
             bVar63);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }